

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [12];
  bool bVar66;
  uint uVar67;
  uint uVar68;
  int iVar69;
  ulong uVar70;
  long lVar71;
  uint uVar72;
  ulong uVar74;
  long lVar75;
  LinearSpace3fa *pLVar76;
  bool bVar77;
  vint4 bi_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar103;
  float fVar129;
  float fVar130;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar131;
  float fVar156;
  float fVar157;
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar159;
  float fVar185;
  float fVar186;
  vint4 ai_1;
  undefined1 auVar160 [16];
  float fVar188;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar187;
  float fVar189;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar190;
  float fVar217;
  float fVar220;
  vint4 ai_2;
  undefined1 auVar192 [16];
  float fVar222;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar191;
  float fVar218;
  float fVar221;
  float fVar223;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  float fVar219;
  float fVar224;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar225;
  float fVar240;
  float fVar241;
  undefined1 auVar226 [16];
  float fVar242;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar255;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar249 [16];
  float fVar256;
  float fVar257;
  undefined1 auVar254 [32];
  vint4 ai;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar291;
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar304;
  float fVar305;
  undefined1 auVar302 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  float fVar314;
  float fVar322;
  float fVar323;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar324;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar336;
  float fVar337;
  vfloat4 a0;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  undefined1 auVar335 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar351 [16];
  undefined1 auVar350 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar355;
  float fVar356;
  undefined1 auVar354 [32];
  float fVar357;
  float fVar361;
  float fVar362;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar368 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5f9;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_428;
  LinearSpace3fa *local_420;
  Primitive *local_418;
  ulong local_410;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar73;
  undefined1 auVar184 [32];
  undefined1 auVar367 [32];
  
  PVar8 = prim[1];
  uVar70 = (ulong)(byte)PVar8;
  lVar71 = uVar70 * 0x25;
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar196 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar196 = vinsertps_avx(auVar196,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar103 = *(float *)(prim + lVar71 + 0x12);
  auVar118 = vsubps_avx(auVar118,*(undefined1 (*) [16])(prim + lVar71 + 6));
  auVar104._0_4_ = fVar103 * auVar118._0_4_;
  auVar104._4_4_ = fVar103 * auVar118._4_4_;
  auVar104._8_4_ = fVar103 * auVar118._8_4_;
  auVar104._12_4_ = fVar103 * auVar118._12_4_;
  auVar258._0_4_ = fVar103 * auVar196._0_4_;
  auVar258._4_4_ = fVar103 * auVar196._4_4_;
  auVar258._8_4_ = fVar103 * auVar196._8_4_;
  auVar258._12_4_ = fVar103 * auVar196._12_4_;
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar70 + 6)));
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar94 = vshufps_avx(auVar258,auVar258,0);
  auVar145 = vshufps_avx(auVar258,auVar258,0x55);
  auVar17 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar103 = auVar17._0_4_;
  fVar129 = auVar17._4_4_;
  fVar243 = auVar17._8_4_;
  fVar130 = auVar17._12_4_;
  fVar190 = auVar145._0_4_;
  fVar217 = auVar145._4_4_;
  fVar220 = auVar145._8_4_;
  fVar222 = auVar145._12_4_;
  fVar159 = auVar94._0_4_;
  fVar185 = auVar94._4_4_;
  fVar186 = auVar94._8_4_;
  fVar188 = auVar94._12_4_;
  auVar329._0_4_ = fVar159 * auVar118._0_4_ + fVar190 * auVar196._0_4_ + fVar103 * auVar168._0_4_;
  auVar329._4_4_ = fVar185 * auVar118._4_4_ + fVar217 * auVar196._4_4_ + fVar129 * auVar168._4_4_;
  auVar329._8_4_ = fVar186 * auVar118._8_4_ + fVar220 * auVar196._8_4_ + fVar243 * auVar168._8_4_;
  auVar329._12_4_ =
       fVar188 * auVar118._12_4_ + fVar222 * auVar196._12_4_ + fVar130 * auVar168._12_4_;
  auVar346._0_4_ = fVar159 * auVar203._0_4_ + fVar190 * auVar15._0_4_ + auVar16._0_4_ * fVar103;
  auVar346._4_4_ = fVar185 * auVar203._4_4_ + fVar217 * auVar15._4_4_ + auVar16._4_4_ * fVar129;
  auVar346._8_4_ = fVar186 * auVar203._8_4_ + fVar220 * auVar15._8_4_ + auVar16._8_4_ * fVar243;
  auVar346._12_4_ = fVar188 * auVar203._12_4_ + fVar222 * auVar15._12_4_ + auVar16._12_4_ * fVar130;
  auVar259._0_4_ = fVar159 * auVar177._0_4_ + fVar190 * auVar117._0_4_ + auVar176._0_4_ * fVar103;
  auVar259._4_4_ = fVar185 * auVar177._4_4_ + fVar217 * auVar117._4_4_ + auVar176._4_4_ * fVar129;
  auVar259._8_4_ = fVar186 * auVar177._8_4_ + fVar220 * auVar117._8_4_ + auVar176._8_4_ * fVar243;
  auVar259._12_4_ =
       fVar188 * auVar177._12_4_ + fVar222 * auVar117._12_4_ + auVar176._12_4_ * fVar130;
  auVar94 = vshufps_avx(auVar104,auVar104,0);
  auVar145 = vshufps_avx(auVar104,auVar104,0x55);
  auVar17 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar103 = auVar17._0_4_;
  fVar129 = auVar17._4_4_;
  fVar243 = auVar17._8_4_;
  fVar130 = auVar17._12_4_;
  fVar190 = auVar145._0_4_;
  fVar217 = auVar145._4_4_;
  fVar220 = auVar145._8_4_;
  fVar222 = auVar145._12_4_;
  fVar159 = auVar94._0_4_;
  fVar185 = auVar94._4_4_;
  fVar186 = auVar94._8_4_;
  fVar188 = auVar94._12_4_;
  auVar132._0_4_ = fVar159 * auVar118._0_4_ + fVar190 * auVar196._0_4_ + fVar103 * auVar168._0_4_;
  auVar132._4_4_ = fVar185 * auVar118._4_4_ + fVar217 * auVar196._4_4_ + fVar129 * auVar168._4_4_;
  auVar132._8_4_ = fVar186 * auVar118._8_4_ + fVar220 * auVar196._8_4_ + fVar243 * auVar168._8_4_;
  auVar132._12_4_ =
       fVar188 * auVar118._12_4_ + fVar222 * auVar196._12_4_ + fVar130 * auVar168._12_4_;
  auVar105._0_4_ = fVar159 * auVar203._0_4_ + auVar16._0_4_ * fVar103 + fVar190 * auVar15._0_4_;
  auVar105._4_4_ = fVar185 * auVar203._4_4_ + auVar16._4_4_ * fVar129 + fVar217 * auVar15._4_4_;
  auVar105._8_4_ = fVar186 * auVar203._8_4_ + auVar16._8_4_ * fVar243 + fVar220 * auVar15._8_4_;
  auVar105._12_4_ = fVar188 * auVar203._12_4_ + auVar16._12_4_ * fVar130 + fVar222 * auVar15._12_4_;
  auVar78._0_4_ = fVar159 * auVar177._0_4_ + fVar190 * auVar117._0_4_ + auVar176._0_4_ * fVar103;
  auVar78._4_4_ = fVar185 * auVar177._4_4_ + fVar217 * auVar117._4_4_ + auVar176._4_4_ * fVar129;
  auVar78._8_4_ = fVar186 * auVar177._8_4_ + fVar220 * auVar117._8_4_ + auVar176._8_4_ * fVar243;
  auVar78._12_4_ = fVar188 * auVar177._12_4_ + fVar222 * auVar117._12_4_ + auVar176._12_4_ * fVar130
  ;
  auVar244._8_4_ = 0x7fffffff;
  auVar244._0_8_ = 0x7fffffff7fffffff;
  auVar244._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar329,auVar244);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar118 = vcmpps_avx(auVar118,auVar192,1);
  auVar196 = vblendvps_avx(auVar329,auVar192,auVar118);
  auVar118 = vandps_avx(auVar346,auVar244);
  auVar118 = vcmpps_avx(auVar118,auVar192,1);
  auVar168 = vblendvps_avx(auVar346,auVar192,auVar118);
  auVar118 = vandps_avx(auVar259,auVar244);
  auVar118 = vcmpps_avx(auVar118,auVar192,1);
  auVar118 = vblendvps_avx(auVar259,auVar192,auVar118);
  auVar203 = vrcpps_avx(auVar196);
  fVar159 = auVar203._0_4_;
  auVar160._0_4_ = fVar159 * auVar196._0_4_;
  fVar185 = auVar203._4_4_;
  auVar160._4_4_ = fVar185 * auVar196._4_4_;
  fVar186 = auVar203._8_4_;
  auVar160._8_4_ = fVar186 * auVar196._8_4_;
  fVar188 = auVar203._12_4_;
  auVar160._12_4_ = fVar188 * auVar196._12_4_;
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = &DAT_3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar196 = vsubps_avx(auVar260,auVar160);
  fVar159 = fVar159 + fVar159 * auVar196._0_4_;
  fVar185 = fVar185 + fVar185 * auVar196._4_4_;
  fVar186 = fVar186 + fVar186 * auVar196._8_4_;
  fVar188 = fVar188 + fVar188 * auVar196._12_4_;
  auVar196 = vrcpps_avx(auVar168);
  fVar190 = auVar196._0_4_;
  auVar226._0_4_ = fVar190 * auVar168._0_4_;
  fVar217 = auVar196._4_4_;
  auVar226._4_4_ = fVar217 * auVar168._4_4_;
  fVar220 = auVar196._8_4_;
  auVar226._8_4_ = fVar220 * auVar168._8_4_;
  fVar222 = auVar196._12_4_;
  auVar226._12_4_ = fVar222 * auVar168._12_4_;
  auVar196 = vsubps_avx(auVar260,auVar226);
  fVar190 = fVar190 + fVar190 * auVar196._0_4_;
  fVar217 = fVar217 + fVar217 * auVar196._4_4_;
  fVar220 = fVar220 + fVar220 * auVar196._8_4_;
  fVar222 = fVar222 + fVar222 * auVar196._12_4_;
  auVar196 = vrcpps_avx(auVar118);
  fVar225 = auVar196._0_4_;
  auVar245._0_4_ = fVar225 * auVar118._0_4_;
  fVar240 = auVar196._4_4_;
  auVar245._4_4_ = fVar240 * auVar118._4_4_;
  fVar241 = auVar196._8_4_;
  auVar245._8_4_ = fVar241 * auVar118._8_4_;
  fVar242 = auVar196._12_4_;
  auVar245._12_4_ = fVar242 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar260,auVar245);
  fVar225 = fVar225 + fVar225 * auVar118._0_4_;
  fVar240 = fVar240 + fVar240 * auVar118._4_4_;
  fVar241 = fVar241 + fVar241 * auVar118._8_4_;
  fVar242 = fVar242 + fVar242 * auVar118._12_4_;
  auVar118 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar71 + 0x16)) *
                           *(float *)(prim + lVar71 + 0x1a)));
  auVar168 = vshufps_avx(auVar118,auVar118,0);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar196 = vpmovsxwd_avx(auVar196);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar118);
  fVar103 = auVar168._0_4_;
  fVar129 = auVar168._4_4_;
  fVar243 = auVar168._8_4_;
  fVar130 = auVar168._12_4_;
  auVar261._0_4_ = auVar196._0_4_ * fVar103 + auVar118._0_4_;
  auVar261._4_4_ = auVar196._4_4_ * fVar129 + auVar118._4_4_;
  auVar261._8_4_ = auVar196._8_4_ * fVar243 + auVar118._8_4_;
  auVar261._12_4_ = auVar196._12_4_ * fVar130 + auVar118._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar118 = vpmovsxwd_avx(auVar168);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar196 = vpmovsxwd_avx(auVar203);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar118);
  auVar270._0_4_ = auVar196._0_4_ * fVar103 + auVar118._0_4_;
  auVar270._4_4_ = auVar196._4_4_ * fVar129 + auVar118._4_4_;
  auVar270._8_4_ = auVar196._8_4_ * fVar243 + auVar118._8_4_;
  auVar270._12_4_ = auVar196._12_4_ * fVar130 + auVar118._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar118 = vpmovsxwd_avx(auVar15);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar74 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar74 + 6);
  auVar196 = vpmovsxwd_avx(auVar16);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar118);
  auVar292._0_4_ = auVar196._0_4_ * fVar103 + auVar118._0_4_;
  auVar292._4_4_ = auVar196._4_4_ * fVar129 + auVar118._4_4_;
  auVar292._8_4_ = auVar196._8_4_ * fVar243 + auVar118._8_4_;
  auVar292._12_4_ = auVar196._12_4_ * fVar130 + auVar118._12_4_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar118 = vpmovsxwd_avx(auVar177);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar196 = vpmovsxwd_avx(auVar117);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar118);
  auVar306._0_4_ = auVar196._0_4_ * fVar103 + auVar118._0_4_;
  auVar306._4_4_ = auVar196._4_4_ * fVar129 + auVar118._4_4_;
  auVar306._8_4_ = auVar196._8_4_ * fVar243 + auVar118._8_4_;
  auVar306._12_4_ = auVar196._12_4_ * fVar130 + auVar118._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar118 = vpmovsxwd_avx(auVar176);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar196 = vpmovsxwd_avx(auVar94);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar168 = vsubps_avx(auVar196,auVar118);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar70) + 6);
  auVar196 = vpmovsxwd_avx(auVar145);
  auVar315._0_4_ = auVar168._0_4_ * fVar103 + auVar118._0_4_;
  auVar315._4_4_ = auVar168._4_4_ * fVar129 + auVar118._4_4_;
  auVar315._8_4_ = auVar168._8_4_ * fVar243 + auVar118._8_4_;
  auVar315._12_4_ = auVar168._12_4_ * fVar130 + auVar118._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar168 = vpmovsxwd_avx(auVar17);
  auVar118 = vcvtdq2ps_avx(auVar196);
  auVar196 = vcvtdq2ps_avx(auVar168);
  auVar196 = vsubps_avx(auVar196,auVar118);
  auVar246._0_4_ = auVar118._0_4_ + auVar196._0_4_ * fVar103;
  auVar246._4_4_ = auVar118._4_4_ + auVar196._4_4_ * fVar129;
  auVar246._8_4_ = auVar118._8_4_ + auVar196._8_4_ * fVar243;
  auVar246._12_4_ = auVar118._12_4_ + auVar196._12_4_ * fVar130;
  auVar118 = vsubps_avx(auVar261,auVar132);
  auVar262._0_4_ = fVar159 * auVar118._0_4_;
  auVar262._4_4_ = fVar185 * auVar118._4_4_;
  auVar262._8_4_ = fVar186 * auVar118._8_4_;
  auVar262._12_4_ = fVar188 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar270,auVar132);
  auVar133._0_4_ = fVar159 * auVar118._0_4_;
  auVar133._4_4_ = fVar185 * auVar118._4_4_;
  auVar133._8_4_ = fVar186 * auVar118._8_4_;
  auVar133._12_4_ = fVar188 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar292,auVar105);
  auVar161._0_4_ = fVar190 * auVar118._0_4_;
  auVar161._4_4_ = fVar217 * auVar118._4_4_;
  auVar161._8_4_ = fVar220 * auVar118._8_4_;
  auVar161._12_4_ = fVar222 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar306,auVar105);
  auVar106._0_4_ = fVar190 * auVar118._0_4_;
  auVar106._4_4_ = fVar217 * auVar118._4_4_;
  auVar106._8_4_ = fVar220 * auVar118._8_4_;
  auVar106._12_4_ = fVar222 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar315,auVar78);
  auVar193._0_4_ = fVar225 * auVar118._0_4_;
  auVar193._4_4_ = fVar240 * auVar118._4_4_;
  auVar193._8_4_ = fVar241 * auVar118._8_4_;
  auVar193._12_4_ = fVar242 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar246,auVar78);
  auVar79._0_4_ = fVar225 * auVar118._0_4_;
  auVar79._4_4_ = fVar240 * auVar118._4_4_;
  auVar79._8_4_ = fVar241 * auVar118._8_4_;
  auVar79._12_4_ = fVar242 * auVar118._12_4_;
  auVar118 = vpminsd_avx(auVar262,auVar133);
  auVar196 = vpminsd_avx(auVar161,auVar106);
  auVar118 = vmaxps_avx(auVar118,auVar196);
  auVar196 = vpminsd_avx(auVar193,auVar79);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar271._4_4_ = uVar6;
  auVar271._0_4_ = uVar6;
  auVar271._8_4_ = uVar6;
  auVar271._12_4_ = uVar6;
  auVar196 = vmaxps_avx(auVar196,auVar271);
  auVar118 = vmaxps_avx(auVar118,auVar196);
  local_2f8._0_4_ = auVar118._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar118._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar118._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar118._12_4_ * 0.99999964;
  auVar118 = vpmaxsd_avx(auVar262,auVar133);
  auVar196 = vpmaxsd_avx(auVar161,auVar106);
  auVar118 = vminps_avx(auVar118,auVar196);
  auVar196 = vpmaxsd_avx(auVar193,auVar79);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar134._4_4_ = uVar6;
  auVar134._0_4_ = uVar6;
  auVar134._8_4_ = uVar6;
  auVar134._12_4_ = uVar6;
  auVar196 = vminps_avx(auVar196,auVar134);
  auVar118 = vminps_avx(auVar118,auVar196);
  auVar80._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar118 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar196 = vpcmpgtd_avx(auVar118,_DAT_01ff0cf0);
  auVar118 = vcmpps_avx(local_2f8,auVar80,2);
  auVar118 = vandps_avx(auVar118,auVar196);
  uVar67 = vmovmskps_avx(auVar118);
  local_5f9 = uVar67 != 0;
  if (uVar67 == 0) {
    return local_5f9;
  }
  uVar67 = uVar67 & 0xff;
  pLVar76 = pre->ray_space + k;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_428 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar368 = ZEXT464(0) << 0x20;
  local_420 = pLVar76;
  local_418 = prim;
LAB_0102eff1:
  lVar71 = 0;
  if (uVar67 != 0) {
    for (; (uVar67 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  local_410 = (ulong)*(uint *)(local_418 + 2);
  pGVar9 = (context->scene->geometries).items[local_410].ptr;
  fVar103 = (pGVar9->time_range).lower;
  fVar243 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar103) / ((pGVar9->time_range).upper - fVar103));
  auVar118 = vroundss_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),9);
  auVar118 = vminss_avx(auVar118,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar118 = vmaxss_avx(ZEXT816(0) << 0x20,auVar118);
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_418 + lVar71 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar118._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar75);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar75);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar70);
  fVar130 = *pfVar4;
  fVar159 = pfVar4[1];
  fVar185 = pfVar4[2];
  fVar186 = pfVar4[3];
  lVar1 = uVar70 + 1;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar188 = *pfVar4;
  fVar190 = pfVar4[1];
  fVar217 = pfVar4[2];
  fVar220 = pfVar4[3];
  lVar2 = uVar70 + 2;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar222 = *pfVar4;
  fVar225 = pfVar4[1];
  fVar240 = pfVar4[2];
  fVar241 = pfVar4[3];
  lVar3 = uVar70 + 3;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar242 = *pfVar4;
  fVar187 = pfVar4[1];
  fVar189 = pfVar4[2];
  fVar191 = pfVar4[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar75);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar75);
  auVar196 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar70);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar218 = *pfVar4;
  fVar221 = pfVar4[1];
  fVar223 = pfVar4[2];
  fVar101 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar102 = *pfVar4;
  fVar303 = pfVar4[1];
  fVar158 = pfVar4[2];
  fVar304 = pfVar4[3];
  fVar243 = fVar243 - auVar118._0_4_;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar305 = *pfVar4;
  fVar314 = pfVar4[1];
  fVar291 = pfVar4[2];
  fVar131 = pfVar4[3];
  fVar103 = auVar368._8_4_;
  fVar129 = auVar368._12_4_;
  local_5b8._0_4_ =
       fVar130 * 0.16666667 + fVar188 * 0.6666667 + fVar222 * 0.16666667 + fVar242 * 0.0;
  local_5b8._4_4_ =
       fVar159 * 0.16666667 + fVar190 * 0.6666667 + fVar225 * 0.16666667 + fVar187 * 0.0;
  fStack_5b0 = fVar185 * 0.16666667 + fVar217 * 0.6666667 + fVar240 * 0.16666667 + fVar189 * fVar103
  ;
  fStack_5ac = fVar186 * 0.16666667 + fVar220 * 0.6666667 + fVar241 * 0.16666667 + fVar191 * fVar129
  ;
  auVar81._0_4_ = fVar222 * 0.5 + fVar242 * 0.0;
  auVar81._4_4_ = fVar225 * 0.5 + fVar187 * 0.0;
  auVar81._8_4_ = fVar240 * 0.5 + fVar189 * fVar103;
  auVar81._12_4_ = fVar241 * 0.5 + fVar191 * fVar129;
  auVar135._0_4_ = fVar188 * 0.0;
  auVar135._4_4_ = fVar190 * 0.0;
  auVar135._8_4_ = fVar103 * fVar217;
  auVar135._12_4_ = fVar129 * fVar220;
  auVar118 = vsubps_avx(auVar81,auVar135);
  auVar136._0_4_ = fVar130 * 0.5;
  auVar136._4_4_ = fVar159 * 0.5;
  auVar136._8_4_ = fVar185 * 0.5;
  auVar136._12_4_ = fVar186 * 0.5;
  auVar117 = vsubps_avx(auVar118,auVar136);
  local_568._0_4_ = auVar196._0_4_;
  local_568._4_4_ = auVar196._4_4_;
  fStack_560 = auVar196._8_4_;
  fStack_55c = auVar196._12_4_;
  auVar82._0_4_ =
       (float)local_568._0_4_ * 0.16666667 +
       fVar218 * 0.6666667 + fVar102 * 0.16666667 + fVar305 * 0.0;
  auVar82._4_4_ =
       (float)local_568._4_4_ * 0.16666667 +
       fVar221 * 0.6666667 + fVar303 * 0.16666667 + fVar314 * 0.0;
  auVar82._8_4_ =
       fStack_560 * 0.16666667 + fVar223 * 0.6666667 + fVar158 * 0.16666667 + fVar291 * fVar103;
  auVar82._12_4_ =
       fStack_55c * 0.16666667 + fVar101 * 0.6666667 + fVar304 * 0.16666667 + fVar131 * fVar129;
  auVar247._0_4_ = fVar102 * 0.5 + fVar305 * 0.0;
  auVar247._4_4_ = fVar303 * 0.5 + fVar314 * 0.0;
  auVar247._8_4_ = fVar158 * 0.5 + fVar291 * fVar103;
  auVar247._12_4_ = fVar304 * 0.5 + fVar131 * fVar129;
  auVar330._0_4_ = fVar218 * 0.0;
  auVar330._4_4_ = fVar221 * 0.0;
  auVar330._8_4_ = fVar103 * fVar223;
  auVar330._12_4_ = fVar129 * fVar101;
  auVar118 = vsubps_avx(auVar247,auVar330);
  auVar331._0_4_ = (float)local_568._0_4_ * 0.5;
  auVar331._4_4_ = (float)local_568._4_4_ * 0.5;
  auVar331._8_4_ = fStack_560 * 0.5;
  auVar331._12_4_ = fStack_55c * 0.5;
  auVar203 = vsubps_avx(auVar118,auVar331);
  auVar194._0_4_ = fVar130 * 0.0;
  auVar194._4_4_ = fVar159 * 0.0;
  auVar194._8_4_ = fVar103 * fVar185;
  auVar194._12_4_ = fVar129 * fVar186;
  auVar248._0_4_ =
       auVar194._0_4_ + fVar188 * 0.16666667 + fVar222 * 0.6666667 + fVar242 * 0.16666667;
  auVar248._4_4_ =
       auVar194._4_4_ + fVar190 * 0.16666667 + fVar225 * 0.6666667 + fVar187 * 0.16666667;
  auVar248._8_4_ =
       auVar194._8_4_ + fVar217 * 0.16666667 + fVar240 * 0.6666667 + fVar189 * 0.16666667;
  auVar248._12_4_ =
       auVar194._12_4_ + fVar220 * 0.16666667 + fVar241 * 0.6666667 + fVar191 * 0.16666667;
  auVar263._0_4_ = fVar242 * 0.5 + fVar222 * 0.0;
  auVar263._4_4_ = fVar187 * 0.5 + fVar225 * 0.0;
  auVar263._8_4_ = fVar189 * 0.5 + fVar103 * fVar240;
  auVar263._12_4_ = fVar191 * 0.5 + fVar129 * fVar241;
  auVar162._0_4_ = fVar188 * 0.5;
  auVar162._4_4_ = fVar190 * 0.5;
  auVar162._8_4_ = fVar217 * 0.5;
  auVar162._12_4_ = fVar220 * 0.5;
  auVar118 = vsubps_avx(auVar263,auVar162);
  auVar176 = vsubps_avx(auVar118,auVar194);
  auVar195._0_4_ = (float)local_568._0_4_ * 0.0;
  auVar195._4_4_ = (float)local_568._4_4_ * 0.0;
  auVar195._8_4_ = fVar103 * fStack_560;
  auVar195._12_4_ = fVar129 * fStack_55c;
  auVar163._0_4_ =
       auVar195._0_4_ + fVar218 * 0.16666667 + fVar102 * 0.6666667 + fVar305 * 0.16666667;
  auVar163._4_4_ =
       auVar195._4_4_ + fVar221 * 0.16666667 + fVar303 * 0.6666667 + fVar314 * 0.16666667;
  auVar163._8_4_ =
       auVar195._8_4_ + fVar223 * 0.16666667 + fVar158 * 0.6666667 + fVar291 * 0.16666667;
  auVar163._12_4_ =
       auVar195._12_4_ + fVar101 * 0.16666667 + fVar304 * 0.6666667 + fVar131 * 0.16666667;
  auVar264._0_4_ = fVar102 * 0.0 + fVar305 * 0.5;
  auVar264._4_4_ = fVar303 * 0.0 + fVar314 * 0.5;
  auVar264._8_4_ = fVar158 * fVar103 + fVar291 * 0.5;
  auVar264._12_4_ = fVar304 * fVar129 + fVar131 * 0.5;
  auVar227._0_4_ = fVar218 * 0.5;
  auVar227._4_4_ = fVar221 * 0.5;
  auVar227._8_4_ = fVar223 * 0.5;
  auVar227._12_4_ = fVar101 * 0.5;
  auVar118 = vsubps_avx(auVar264,auVar227);
  auVar16 = vsubps_avx(auVar118,auVar195);
  auVar118 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar196 = vshufps_avx(auVar82,auVar82,0xc9);
  fVar131 = auVar117._0_4_;
  auVar228._0_4_ = fVar131 * auVar196._0_4_;
  fVar156 = auVar117._4_4_;
  auVar228._4_4_ = fVar156 * auVar196._4_4_;
  fVar157 = auVar117._8_4_;
  auVar228._8_4_ = fVar157 * auVar196._8_4_;
  fVar322 = auVar117._12_4_;
  auVar228._12_4_ = fVar322 * auVar196._12_4_;
  auVar83._0_4_ = auVar118._0_4_ * auVar82._0_4_;
  auVar83._4_4_ = auVar118._4_4_ * auVar82._4_4_;
  auVar83._8_4_ = auVar118._8_4_ * auVar82._8_4_;
  auVar83._12_4_ = auVar118._12_4_ * auVar82._12_4_;
  auVar196 = vsubps_avx(auVar83,auVar228);
  auVar168 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar196 = vshufps_avx(auVar203,auVar203,0xc9);
  auVar84._0_4_ = fVar131 * auVar196._0_4_;
  auVar84._4_4_ = fVar156 * auVar196._4_4_;
  auVar84._8_4_ = fVar157 * auVar196._8_4_;
  auVar84._12_4_ = fVar322 * auVar196._12_4_;
  auVar265._0_4_ = auVar203._0_4_ * auVar118._0_4_;
  auVar265._4_4_ = auVar203._4_4_ * auVar118._4_4_;
  auVar265._8_4_ = auVar203._8_4_ * auVar118._8_4_;
  auVar265._12_4_ = auVar203._12_4_ * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar265,auVar84);
  auVar203 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar196 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar118 = vshufps_avx(auVar163,auVar163,0xc9);
  fVar219 = auVar176._0_4_;
  auVar272._0_4_ = fVar219 * auVar118._0_4_;
  fVar323 = auVar176._4_4_;
  auVar272._4_4_ = fVar323 * auVar118._4_4_;
  fVar224 = auVar176._8_4_;
  auVar272._8_4_ = fVar224 * auVar118._8_4_;
  fVar324 = auVar176._12_4_;
  auVar272._12_4_ = fVar324 * auVar118._12_4_;
  auVar164._0_4_ = auVar196._0_4_ * auVar163._0_4_;
  auVar164._4_4_ = auVar196._4_4_ * auVar163._4_4_;
  auVar164._8_4_ = auVar196._8_4_ * auVar163._8_4_;
  auVar164._12_4_ = auVar196._12_4_ * auVar163._12_4_;
  auVar118 = vsubps_avx(auVar164,auVar272);
  auVar15 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar118 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar273._0_4_ = fVar219 * auVar118._0_4_;
  auVar273._4_4_ = fVar323 * auVar118._4_4_;
  auVar273._8_4_ = fVar224 * auVar118._8_4_;
  auVar273._12_4_ = fVar324 * auVar118._12_4_;
  auVar118 = vdpps_avx(auVar168,auVar168,0x7f);
  auVar85._0_4_ = auVar196._0_4_ * auVar16._0_4_;
  auVar85._4_4_ = auVar196._4_4_ * auVar16._4_4_;
  auVar85._8_4_ = auVar196._8_4_ * auVar16._8_4_;
  auVar85._12_4_ = auVar196._12_4_ * auVar16._12_4_;
  auVar196 = vsubps_avx(auVar85,auVar273);
  auVar16 = vshufps_avx(auVar196,auVar196,0xc9);
  fVar129 = auVar118._0_4_;
  auVar274._4_12_ = auVar368._4_12_;
  auVar274._0_4_ = fVar129;
  auVar196 = vrsqrtss_avx(auVar274,auVar274);
  fVar103 = auVar196._0_4_;
  auVar196 = ZEXT416((uint)(fVar103 * 1.5 - fVar129 * 0.5 * fVar103 * fVar103 * fVar103));
  auVar177 = vshufps_avx(auVar196,auVar196,0);
  auVar196 = vdpps_avx(auVar168,auVar203,0x7f);
  fVar191 = auVar177._0_4_ * auVar168._0_4_;
  fVar218 = auVar177._4_4_ * auVar168._4_4_;
  fVar221 = auVar177._8_4_ * auVar168._8_4_;
  fVar223 = auVar177._12_4_ * auVar168._12_4_;
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar266._0_4_ = auVar118._0_4_ * auVar203._0_4_;
  auVar266._4_4_ = auVar118._4_4_ * auVar203._4_4_;
  auVar266._8_4_ = auVar118._8_4_ * auVar203._8_4_;
  auVar266._12_4_ = auVar118._12_4_ * auVar203._12_4_;
  auVar118 = vshufps_avx(auVar196,auVar196,0);
  auVar229._0_4_ = auVar118._0_4_ * auVar168._0_4_;
  auVar229._4_4_ = auVar118._4_4_ * auVar168._4_4_;
  auVar229._8_4_ = auVar118._8_4_ * auVar168._8_4_;
  auVar229._12_4_ = auVar118._12_4_ * auVar168._12_4_;
  auVar94 = vsubps_avx(auVar266,auVar229);
  auVar118 = vrcpss_avx(auVar274,auVar274);
  auVar118 = ZEXT416((uint)((2.0 - fVar129 * auVar118._0_4_) * auVar118._0_4_));
  auVar168 = vshufps_avx(auVar118,auVar118,0);
  auVar118 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar101 = auVar118._0_4_;
  auVar275._4_12_ = auVar368._4_12_;
  auVar275._0_4_ = fVar101;
  auVar196 = vrsqrtss_avx(auVar275,auVar275);
  fVar241 = auVar196._0_4_;
  auVar196 = vdpps_avx(auVar15,auVar16,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar363._0_4_ = auVar118._0_4_ * auVar16._0_4_;
  auVar363._4_4_ = auVar118._4_4_ * auVar16._4_4_;
  auVar363._8_4_ = auVar118._8_4_ * auVar16._8_4_;
  auVar363._12_4_ = auVar118._12_4_ * auVar16._12_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar75);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar75);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * uVar70);
  auVar65 = *pauVar5;
  fVar103 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar129 = *pfVar4;
  fVar130 = pfVar4[1];
  fVar159 = pfVar4[2];
  fVar185 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar186 = *pfVar4;
  fVar188 = pfVar4[1];
  fVar190 = pfVar4[2];
  fVar217 = pfVar4[3];
  auVar118 = vshufps_avx(auVar196,auVar196,0);
  auVar86._0_4_ = auVar118._0_4_ * auVar15._0_4_;
  auVar86._4_4_ = auVar118._4_4_ * auVar15._4_4_;
  auVar86._8_4_ = auVar118._8_4_ * auVar15._8_4_;
  auVar86._12_4_ = auVar118._12_4_ * auVar15._12_4_;
  auVar16 = vsubps_avx(auVar363,auVar86);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar220 = *pfVar4;
  fVar222 = pfVar4[1];
  fVar225 = pfVar4[2];
  fVar240 = pfVar4[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar75);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar75);
  auVar118 = ZEXT416((uint)(fVar241 * 1.5 - fVar101 * 0.5 * fVar241 * fVar241 * fVar241));
  auVar196 = vshufps_avx(auVar118,auVar118,0);
  fVar241 = auVar196._0_4_ * auVar15._0_4_;
  fVar242 = auVar196._4_4_ * auVar15._4_4_;
  fVar187 = auVar196._8_4_ * auVar15._8_4_;
  fVar189 = auVar196._12_4_ * auVar15._12_4_;
  auVar118 = vrcpss_avx(auVar275,auVar275);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - auVar118._0_4_ * fVar101)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar203 = vshufps_avx(_local_5b8,_local_5b8,0xff);
  auVar307._0_4_ = auVar203._0_4_ * fVar191;
  auVar307._4_4_ = auVar203._4_4_ * fVar218;
  auVar307._8_4_ = auVar203._8_4_ * fVar221;
  auVar307._12_4_ = auVar203._12_4_ * fVar223;
  auVar15 = vshufps_avx(auVar117,auVar117,0xff);
  auVar145 = vsubps_avx(_local_5b8,auVar307);
  auVar197._0_4_ =
       auVar15._0_4_ * fVar191 + auVar203._0_4_ * auVar177._0_4_ * auVar94._0_4_ * auVar168._0_4_;
  auVar197._4_4_ =
       auVar15._4_4_ * fVar218 + auVar203._4_4_ * auVar177._4_4_ * auVar94._4_4_ * auVar168._4_4_;
  auVar197._8_4_ =
       auVar15._8_4_ * fVar221 + auVar203._8_4_ * auVar177._8_4_ * auVar94._8_4_ * auVar168._8_4_;
  auVar197._12_4_ =
       auVar15._12_4_ * fVar223 +
       auVar203._12_4_ * auVar177._12_4_ * auVar94._12_4_ * auVar168._12_4_;
  auVar177 = vsubps_avx(auVar117,auVar197);
  local_5b8._0_4_ = (float)local_5b8._0_4_ + auVar307._0_4_;
  local_5b8._4_4_ = (float)local_5b8._4_4_ + auVar307._4_4_;
  fStack_5b0 = fStack_5b0 + auVar307._8_4_;
  fStack_5ac = fStack_5ac + auVar307._12_4_;
  auVar168 = vshufps_avx(auVar248,auVar248,0xff);
  auVar137._0_4_ = auVar168._0_4_ * fVar241;
  auVar137._4_4_ = auVar168._4_4_ * fVar242;
  auVar137._8_4_ = auVar168._8_4_ * fVar187;
  auVar137._12_4_ = auVar168._12_4_ * fVar189;
  auVar203 = vshufps_avx(auVar176,auVar176,0xff);
  auVar117 = vsubps_avx(auVar248,auVar137);
  auVar87._0_4_ =
       auVar203._0_4_ * fVar241 + auVar168._0_4_ * auVar196._0_4_ * auVar16._0_4_ * auVar118._0_4_;
  auVar87._4_4_ =
       auVar203._4_4_ * fVar242 + auVar168._4_4_ * auVar196._4_4_ * auVar16._4_4_ * auVar118._4_4_;
  auVar87._8_4_ =
       auVar203._8_4_ * fVar187 + auVar168._8_4_ * auVar196._8_4_ * auVar16._8_4_ * auVar118._8_4_;
  auVar87._12_4_ =
       auVar203._12_4_ * fVar189 +
       auVar168._12_4_ * auVar196._12_4_ * auVar16._12_4_ * auVar118._12_4_;
  auVar176 = vsubps_avx(auVar176,auVar87);
  local_568._4_4_ = auVar248._4_4_ + auVar137._4_4_;
  local_568._0_4_ = auVar248._0_4_ + auVar137._0_4_;
  fStack_560 = auVar248._8_4_ + auVar137._8_4_;
  fStack_55c = auVar248._12_4_ + auVar137._12_4_;
  local_588._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar129 * 0.6666667 + fVar186 * 0.16666667 + fVar220 * 0.0;
  local_588._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar130 * 0.6666667 + fVar188 * 0.16666667 + fVar222 * 0.0;
  fStack_580 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar159 * 0.6666667 + fVar190 * 0.16666667 + fVar225 * 0.0;
  fStack_57c = fVar103 * 0.16666667 + fVar185 * 0.6666667 + fVar217 * 0.16666667 + fVar240 * 0.0;
  auVar88._0_4_ = fVar186 * 0.5 + fVar220 * 0.0;
  auVar88._4_4_ = fVar188 * 0.5 + fVar222 * 0.0;
  auVar88._8_4_ = fVar190 * 0.5 + fVar225 * 0.0;
  auVar88._12_4_ = fVar217 * 0.5 + fVar240 * 0.0;
  auVar107._0_4_ = fVar129 * 0.0;
  auVar107._4_4_ = fVar130 * 0.0;
  auVar107._8_4_ = fVar159 * 0.0;
  auVar107._12_4_ = fVar185 * 0.0;
  auVar118 = vsubps_avx(auVar88,auVar107);
  auVar108._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar108._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar108._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar108._12_4_ = fVar103 * 0.5;
  auVar94 = vsubps_avx(auVar118,auVar108);
  pfVar4 = (float *)(lVar12 + lVar2 * lVar11);
  fVar241 = *pfVar4;
  fVar242 = pfVar4[1];
  fVar187 = pfVar4[2];
  fVar189 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar11 * lVar3);
  fVar191 = *pfVar4;
  fVar218 = pfVar4[1];
  fVar221 = pfVar4[2];
  fVar223 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar1 * lVar11);
  fVar101 = *pfVar4;
  fVar102 = pfVar4[1];
  fVar303 = pfVar4[2];
  fVar158 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + uVar70 * lVar11);
  fVar304 = *pfVar4;
  fVar305 = pfVar4[1];
  fVar314 = pfVar4[2];
  fVar291 = pfVar4[3];
  auVar198._0_4_ = fVar304 * 0.16666667 + fVar101 * 0.6666667 + fVar241 * 0.16666667 + fVar191 * 0.0
  ;
  auVar198._4_4_ = fVar305 * 0.16666667 + fVar102 * 0.6666667 + fVar242 * 0.16666667 + fVar218 * 0.0
  ;
  auVar198._8_4_ = fVar314 * 0.16666667 + fVar303 * 0.6666667 + fVar187 * 0.16666667 + fVar221 * 0.0
  ;
  auVar198._12_4_ =
       fVar291 * 0.16666667 + fVar158 * 0.6666667 + fVar189 * 0.16666667 + fVar223 * 0.0;
  auVar165._0_4_ = fVar241 * 0.5 + fVar191 * 0.0;
  auVar165._4_4_ = fVar242 * 0.5 + fVar218 * 0.0;
  auVar165._8_4_ = fVar187 * 0.5 + fVar221 * 0.0;
  auVar165._12_4_ = fVar189 * 0.5 + fVar223 * 0.0;
  auVar276._0_4_ = fVar101 * 0.0;
  auVar276._4_4_ = fVar102 * 0.0;
  auVar276._8_4_ = fVar303 * 0.0;
  auVar276._12_4_ = fVar158 * 0.0;
  auVar118 = vsubps_avx(auVar165,auVar276);
  auVar277._0_4_ = fVar304 * 0.5;
  auVar277._4_4_ = fVar305 * 0.5;
  auVar277._8_4_ = fVar314 * 0.5;
  auVar277._12_4_ = fVar291 * 0.5;
  auVar196 = vsubps_avx(auVar118,auVar277);
  auVar278._0_4_ = fVar186 * 0.0 + fVar220 * 0.5;
  auVar278._4_4_ = fVar188 * 0.0 + fVar222 * 0.5;
  auVar278._8_4_ = fVar190 * 0.0 + fVar225 * 0.5;
  auVar278._12_4_ = fVar217 * 0.0 + fVar240 * 0.5;
  auVar332._0_4_ = fVar129 * 0.5;
  auVar332._4_4_ = fVar130 * 0.5;
  auVar332._8_4_ = fVar159 * 0.5;
  auVar332._12_4_ = fVar185 * 0.5;
  auVar118 = vsubps_avx(auVar278,auVar332);
  local_5f8 = auVar65._0_4_;
  fStack_5f4 = auVar65._4_4_;
  fStack_5f0 = auVar65._8_4_;
  auVar316._0_4_ = local_5f8 * 0.0;
  auVar316._4_4_ = fStack_5f4 * 0.0;
  auVar316._8_4_ = fStack_5f0 * 0.0;
  auVar316._12_4_ = fVar103 * 0.0;
  auVar333._0_4_ =
       auVar316._0_4_ + fVar129 * 0.16666667 + fVar220 * 0.16666667 + fVar186 * 0.6666667;
  auVar333._4_4_ =
       auVar316._4_4_ + fVar130 * 0.16666667 + fVar222 * 0.16666667 + fVar188 * 0.6666667;
  auVar333._8_4_ =
       auVar316._8_4_ + fVar159 * 0.16666667 + fVar225 * 0.16666667 + fVar190 * 0.6666667;
  auVar333._12_4_ =
       auVar316._12_4_ + fVar185 * 0.16666667 + fVar240 * 0.16666667 + fVar217 * 0.6666667;
  auVar17 = vsubps_avx(auVar118,auVar316);
  auVar138._0_4_ = fVar241 * 0.0 + fVar191 * 0.5;
  auVar138._4_4_ = fVar242 * 0.0 + fVar218 * 0.5;
  auVar138._8_4_ = fVar187 * 0.0 + fVar221 * 0.5;
  auVar138._12_4_ = fVar189 * 0.0 + fVar223 * 0.5;
  auVar89._0_4_ = fVar101 * 0.5;
  auVar89._4_4_ = fVar102 * 0.5;
  auVar89._8_4_ = fVar303 * 0.5;
  auVar89._12_4_ = fVar158 * 0.5;
  auVar118 = vsubps_avx(auVar138,auVar89);
  auVar109._0_4_ = fVar304 * 0.0;
  auVar109._4_4_ = fVar305 * 0.0;
  auVar109._8_4_ = fVar314 * 0.0;
  auVar109._12_4_ = fVar291 * 0.0;
  auVar139._0_4_ =
       auVar109._0_4_ + fVar101 * 0.16666667 + fVar241 * 0.6666667 + fVar191 * 0.16666667;
  auVar139._4_4_ =
       auVar109._4_4_ + fVar102 * 0.16666667 + fVar242 * 0.6666667 + fVar218 * 0.16666667;
  auVar139._8_4_ =
       auVar109._8_4_ + fVar303 * 0.16666667 + fVar187 * 0.6666667 + fVar221 * 0.16666667;
  auVar139._12_4_ =
       auVar109._12_4_ + fVar158 * 0.16666667 + fVar189 * 0.6666667 + fVar223 * 0.16666667;
  auVar203 = vsubps_avx(auVar118,auVar109);
  auVar118 = vshufps_avx(auVar198,auVar198,0xc9);
  fVar217 = auVar94._0_4_;
  auVar110._0_4_ = fVar217 * auVar118._0_4_;
  fVar220 = auVar94._4_4_;
  auVar110._4_4_ = fVar220 * auVar118._4_4_;
  fVar222 = auVar94._8_4_;
  auVar110._8_4_ = fVar222 * auVar118._8_4_;
  fVar241 = auVar94._12_4_;
  auVar110._12_4_ = fVar241 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar199._0_4_ = auVar118._0_4_ * auVar198._0_4_;
  auVar199._4_4_ = auVar118._4_4_ * auVar198._4_4_;
  auVar199._8_4_ = auVar118._8_4_ * auVar198._8_4_;
  auVar199._12_4_ = auVar118._12_4_ * auVar198._12_4_;
  auVar168 = vsubps_avx(auVar199,auVar110);
  auVar200._0_4_ = auVar118._0_4_ * auVar196._0_4_;
  auVar200._4_4_ = auVar118._4_4_ * auVar196._4_4_;
  auVar200._8_4_ = auVar118._8_4_ * auVar196._8_4_;
  auVar200._12_4_ = auVar118._12_4_ * auVar196._12_4_;
  auVar118 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar166._0_4_ = fVar217 * auVar118._0_4_;
  auVar166._4_4_ = fVar220 * auVar118._4_4_;
  auVar166._8_4_ = fVar222 * auVar118._8_4_;
  auVar166._12_4_ = fVar241 * auVar118._12_4_;
  auVar15 = vsubps_avx(auVar200,auVar166);
  auVar118 = vshufps_avx(auVar139,auVar139,0xc9);
  fVar240 = auVar17._0_4_;
  auVar201._0_4_ = fVar240 * auVar118._0_4_;
  fVar187 = auVar17._4_4_;
  auVar201._4_4_ = fVar187 * auVar118._4_4_;
  fVar189 = auVar17._8_4_;
  auVar201._8_4_ = fVar189 * auVar118._8_4_;
  fVar218 = auVar17._12_4_;
  auVar201._12_4_ = fVar218 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar140._0_4_ = auVar118._0_4_ * auVar139._0_4_;
  auVar140._4_4_ = auVar118._4_4_ * auVar139._4_4_;
  auVar140._8_4_ = auVar118._8_4_ * auVar139._8_4_;
  auVar140._12_4_ = auVar118._12_4_ * auVar139._12_4_;
  auVar16 = vsubps_avx(auVar140,auVar201);
  auVar168 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar202._0_4_ = auVar118._0_4_ * auVar203._0_4_;
  auVar202._4_4_ = auVar118._4_4_ * auVar203._4_4_;
  auVar202._8_4_ = auVar118._8_4_ * auVar203._8_4_;
  auVar202._12_4_ = auVar118._12_4_ * auVar203._12_4_;
  auVar118 = vshufps_avx(auVar203,auVar203,0xc9);
  auVar90._0_4_ = fVar240 * auVar118._0_4_;
  auVar90._4_4_ = fVar187 * auVar118._4_4_;
  auVar90._8_4_ = fVar189 * auVar118._8_4_;
  auVar90._12_4_ = fVar218 * auVar118._12_4_;
  auVar118 = vdpps_avx(auVar168,auVar168,0x7f);
  auVar78 = vsubps_avx(auVar202,auVar90);
  fVar103 = auVar118._0_4_;
  auVar203 = ZEXT416((uint)fVar103);
  auVar196 = vrsqrtss_avx(auVar203,auVar203);
  fVar129 = auVar196._0_4_;
  auVar196 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar347._0_4_ = auVar118._0_4_ * auVar196._0_4_;
  auVar347._4_4_ = auVar118._4_4_ * auVar196._4_4_;
  auVar347._8_4_ = auVar118._8_4_ * auVar196._8_4_;
  auVar347._12_4_ = auVar118._12_4_ * auVar196._12_4_;
  auVar118 = vdpps_avx(auVar168,auVar196,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar167._0_4_ = auVar118._0_4_ * auVar168._0_4_;
  auVar167._4_4_ = auVar118._4_4_ * auVar168._4_4_;
  auVar167._8_4_ = auVar118._8_4_ * auVar168._8_4_;
  auVar167._12_4_ = auVar118._12_4_ * auVar168._12_4_;
  auVar79 = vsubps_avx(auVar347,auVar167);
  auVar118 = vrcpss_avx(auVar203,auVar203);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - fVar103 * auVar118._0_4_)));
  auVar203 = vshufps_avx(auVar118,auVar118,0);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar118 = ZEXT416((uint)(fVar129 * 1.5 - fVar103 * 0.5 * fVar129 * fVar129 * fVar129));
  auVar16 = vshufps_avx(auVar118,auVar118,0);
  fVar103 = auVar168._0_4_ * auVar16._0_4_;
  fVar129 = auVar168._4_4_ * auVar16._4_4_;
  fVar130 = auVar168._8_4_ * auVar16._8_4_;
  fVar159 = auVar168._12_4_ * auVar16._12_4_;
  auVar118 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar185 = auVar118._0_4_;
  auVar168 = ZEXT416((uint)fVar185);
  auVar196 = vrsqrtss_avx(auVar168,auVar168);
  fVar186 = auVar196._0_4_;
  auVar196 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar348._0_4_ = auVar118._0_4_ * auVar196._0_4_;
  auVar348._4_4_ = auVar118._4_4_ * auVar196._4_4_;
  auVar348._8_4_ = auVar118._8_4_ * auVar196._8_4_;
  auVar348._12_4_ = auVar118._12_4_ * auVar196._12_4_;
  auVar118 = vdpps_avx(auVar15,auVar196,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar91._0_4_ = auVar118._0_4_ * auVar15._0_4_;
  auVar91._4_4_ = auVar118._4_4_ * auVar15._4_4_;
  auVar91._8_4_ = auVar118._8_4_ * auVar15._8_4_;
  auVar91._12_4_ = auVar118._12_4_ * auVar15._12_4_;
  auVar78 = vsubps_avx(auVar348,auVar91);
  auVar118 = vrcpss_avx(auVar168,auVar168);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - fVar185 * auVar118._0_4_)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar196 = ZEXT416((uint)(fVar186 * 1.5 - fVar185 * 0.5 * fVar186 * fVar186 * fVar186));
  auVar196 = vshufps_avx(auVar196,auVar196,0);
  fVar185 = auVar15._0_4_ * auVar196._0_4_;
  fVar186 = auVar15._4_4_ * auVar196._4_4_;
  fVar188 = auVar15._8_4_ * auVar196._8_4_;
  fVar190 = auVar15._12_4_ * auVar196._12_4_;
  auVar168 = vshufps_avx(auVar94,auVar94,0xff);
  auVar15 = vshufps_avx(_local_588,_local_588,0xff);
  auVar111._0_4_ = auVar15._0_4_ * fVar103;
  auVar111._4_4_ = auVar15._4_4_ * fVar129;
  auVar111._8_4_ = auVar15._8_4_ * fVar130;
  auVar111._12_4_ = auVar15._12_4_ * fVar159;
  auVar141._0_4_ =
       auVar168._0_4_ * fVar103 + auVar15._0_4_ * auVar16._0_4_ * auVar79._0_4_ * auVar203._0_4_;
  auVar141._4_4_ =
       auVar168._4_4_ * fVar129 + auVar15._4_4_ * auVar16._4_4_ * auVar79._4_4_ * auVar203._4_4_;
  auVar141._8_4_ =
       auVar168._8_4_ * fVar130 + auVar15._8_4_ * auVar16._8_4_ * auVar79._8_4_ * auVar203._8_4_;
  auVar141._12_4_ =
       auVar168._12_4_ * fVar159 +
       auVar15._12_4_ * auVar16._12_4_ * auVar79._12_4_ * auVar203._12_4_;
  auVar15 = vsubps_avx(_local_588,auVar111);
  local_588._0_4_ = (float)local_588._0_4_ + auVar111._0_4_;
  local_588._4_4_ = (float)local_588._4_4_ + auVar111._4_4_;
  fStack_580 = fStack_580 + auVar111._8_4_;
  fStack_57c = fStack_57c + auVar111._12_4_;
  auVar16 = vsubps_avx(auVar94,auVar141);
  auVar168 = vshufps_avx(auVar17,auVar17,0xff);
  auVar203 = vshufps_avx(auVar333,auVar333,0xff);
  auVar204._0_4_ = auVar203._0_4_ * fVar185;
  auVar204._4_4_ = auVar203._4_4_ * fVar186;
  auVar204._8_4_ = auVar203._8_4_ * fVar188;
  auVar204._12_4_ = auVar203._12_4_ * fVar190;
  auVar142._0_4_ =
       auVar168._0_4_ * fVar185 + auVar203._0_4_ * auVar196._0_4_ * auVar78._0_4_ * auVar118._0_4_;
  auVar142._4_4_ =
       auVar168._4_4_ * fVar186 + auVar203._4_4_ * auVar196._4_4_ * auVar78._4_4_ * auVar118._4_4_;
  auVar142._8_4_ =
       auVar168._8_4_ * fVar188 + auVar203._8_4_ * auVar196._8_4_ * auVar78._8_4_ * auVar118._8_4_;
  auVar142._12_4_ =
       auVar168._12_4_ * fVar190 +
       auVar203._12_4_ * auVar196._12_4_ * auVar78._12_4_ * auVar118._12_4_;
  auVar168 = vsubps_avx(auVar333,auVar204);
  auVar349._0_4_ = auVar333._0_4_ + auVar204._0_4_;
  auVar349._4_4_ = auVar333._4_4_ + auVar204._4_4_;
  auVar349._8_4_ = auVar333._8_4_ + auVar204._8_4_;
  auVar349._12_4_ = auVar333._12_4_ + auVar204._12_4_;
  auVar203 = vsubps_avx(auVar17,auVar142);
  local_458 = auVar177._0_4_;
  fStack_454 = auVar177._4_4_;
  fStack_450 = auVar177._8_4_;
  fStack_44c = auVar177._12_4_;
  local_528 = auVar145._0_4_;
  fStack_524 = auVar145._4_4_;
  fStack_520 = auVar145._8_4_;
  fStack_51c = auVar145._12_4_;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
  auVar196 = vshufps_avx(ZEXT416((uint)(1.0 - fVar243)),ZEXT416((uint)(1.0 - fVar243)),0);
  fVar159 = auVar118._0_4_;
  fVar185 = auVar118._4_4_;
  fVar186 = auVar118._8_4_;
  fVar188 = auVar118._12_4_;
  fVar103 = auVar196._0_4_;
  fVar129 = auVar196._4_4_;
  fVar243 = auVar196._8_4_;
  fVar130 = auVar196._12_4_;
  local_3c8._0_4_ = fVar103 * local_528 + fVar159 * auVar15._0_4_;
  local_3c8._4_4_ = fVar129 * fStack_524 + fVar185 * auVar15._4_4_;
  fStack_3c0 = fVar243 * fStack_520 + fVar186 * auVar15._8_4_;
  fStack_3bc = fVar130 * fStack_51c + fVar188 * auVar15._12_4_;
  fVar225 = (local_528 + local_458 * 0.33333334) * fVar103 +
            (auVar15._0_4_ + auVar16._0_4_ * 0.33333334) * fVar159;
  fVar242 = (fStack_524 + fStack_454 * 0.33333334) * fVar129 +
            (auVar15._4_4_ + auVar16._4_4_ * 0.33333334) * fVar185;
  fVar191 = (fStack_520 + fStack_450 * 0.33333334) * fVar243 +
            (auVar15._8_4_ + auVar16._8_4_ * 0.33333334) * fVar186;
  fVar223 = (fStack_51c + fStack_44c * 0.33333334) * fVar130 +
            (auVar15._12_4_ + auVar16._12_4_ * 0.33333334) * fVar188;
  local_508 = auVar176._0_4_;
  fStack_504 = auVar176._4_4_;
  fStack_500 = auVar176._8_4_;
  fStack_4fc = auVar176._12_4_;
  auVar230._0_4_ = local_508 * 0.33333334;
  auVar230._4_4_ = fStack_504 * 0.33333334;
  auVar230._8_4_ = fStack_500 * 0.33333334;
  auVar230._12_4_ = fStack_4fc * 0.33333334;
  auVar118 = vsubps_avx(auVar117,auVar230);
  auVar279._0_4_ = (fVar219 + auVar87._0_4_) * 0.33333334;
  auVar279._4_4_ = (fVar323 + auVar87._4_4_) * 0.33333334;
  auVar279._8_4_ = (fVar224 + auVar87._8_4_) * 0.33333334;
  auVar279._12_4_ = (fVar324 + auVar87._12_4_) * 0.33333334;
  auVar196 = vsubps_avx(_local_568,auVar279);
  auVar205._0_4_ = auVar203._0_4_ * 0.33333334;
  auVar205._4_4_ = auVar203._4_4_ * 0.33333334;
  auVar205._8_4_ = auVar203._8_4_ * 0.33333334;
  auVar205._12_4_ = auVar203._12_4_ * 0.33333334;
  auVar203 = vsubps_avx(auVar168,auVar205);
  auVar143._0_4_ = (fVar240 + auVar142._0_4_) * 0.33333334;
  auVar143._4_4_ = (fVar187 + auVar142._4_4_) * 0.33333334;
  auVar143._8_4_ = (fVar189 + auVar142._8_4_) * 0.33333334;
  auVar143._12_4_ = (fVar218 + auVar142._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar349,auVar143);
  local_3d8._0_4_ = fVar103 * auVar118._0_4_ + fVar159 * auVar203._0_4_;
  local_3d8._4_4_ = fVar129 * auVar118._4_4_ + fVar185 * auVar203._4_4_;
  fStack_3d0 = fVar243 * auVar118._8_4_ + fVar186 * auVar203._8_4_;
  fStack_3cc = fVar130 * auVar118._12_4_ + fVar188 * auVar203._12_4_;
  local_3e8._0_4_ = auVar168._0_4_ * fVar159 + auVar117._0_4_ * fVar103;
  local_3e8._4_4_ = auVar168._4_4_ * fVar185 + auVar117._4_4_ * fVar129;
  fStack_3e0 = auVar168._8_4_ * fVar186 + auVar117._8_4_ * fVar243;
  fStack_3dc = auVar168._12_4_ * fVar188 + auVar117._12_4_ * fVar130;
  local_3f8._0_4_ = fVar103 * (float)local_5b8._0_4_ + fVar159 * (float)local_588._0_4_;
  local_3f8._4_4_ = fVar129 * (float)local_5b8._4_4_ + fVar185 * (float)local_588._4_4_;
  fStack_3f0 = fVar243 * fStack_5b0 + fVar186 * fStack_580;
  fStack_3ec = fVar130 * fStack_5ac + fVar188 * fStack_57c;
  fVar240 = fVar103 * ((float)local_5b8._0_4_ + (fVar131 + auVar197._0_4_) * 0.33333334) +
            ((fVar217 + auVar141._0_4_) * 0.33333334 + (float)local_588._0_4_) * fVar159;
  fVar187 = fVar129 * ((float)local_5b8._4_4_ + (fVar156 + auVar197._4_4_) * 0.33333334) +
            ((fVar220 + auVar141._4_4_) * 0.33333334 + (float)local_588._4_4_) * fVar185;
  fVar218 = fVar243 * (fStack_5b0 + (fVar157 + auVar197._8_4_) * 0.33333334) +
            ((fVar222 + auVar141._8_4_) * 0.33333334 + fStack_580) * fVar186;
  fVar101 = fVar130 * (fStack_5ac + (fVar322 + auVar197._12_4_) * 0.33333334) +
            ((fVar241 + auVar141._12_4_) * 0.33333334 + fStack_57c) * fVar188;
  fVar241 = auVar196._0_4_ * fVar103 + fVar159 * auVar15._0_4_;
  fVar189 = auVar196._4_4_ * fVar129 + fVar185 * auVar15._4_4_;
  fVar221 = auVar196._8_4_ * fVar243 + fVar186 * auVar15._8_4_;
  fVar102 = auVar196._12_4_ * fVar130 + fVar188 * auVar15._12_4_;
  local_408._0_4_ = (auVar248._0_4_ + auVar137._0_4_) * fVar103 + auVar349._0_4_ * fVar159;
  local_408._4_4_ = (auVar248._4_4_ + auVar137._4_4_) * fVar129 + auVar349._4_4_ * fVar185;
  fStack_400 = (auVar248._8_4_ + auVar137._8_4_) * fVar243 + auVar349._8_4_ * fVar186;
  fStack_3fc = (auVar248._12_4_ + auVar137._12_4_) * fVar130 + auVar349._12_4_ * fVar188;
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3c8,auVar118);
  auVar168 = vmovsldup_avx(local_268);
  auVar196 = vmovshdup_avx(local_268);
  auVar203 = vshufps_avx(local_268,local_268,0xaa);
  fVar103 = (pLVar76->vx).field_0.m128[0];
  fVar129 = (pLVar76->vx).field_0.m128[1];
  fVar243 = (pLVar76->vx).field_0.m128[2];
  fVar130 = (pLVar76->vx).field_0.m128[3];
  fVar159 = (pLVar76->vy).field_0.m128[0];
  fVar185 = (pLVar76->vy).field_0.m128[1];
  fVar186 = (pLVar76->vy).field_0.m128[2];
  fVar188 = (pLVar76->vy).field_0.m128[3];
  fVar190 = (pLVar76->vz).field_0.m128[0];
  fVar217 = (pLVar76->vz).field_0.m128[1];
  fVar220 = (pLVar76->vz).field_0.m128[2];
  fVar222 = (pLVar76->vz).field_0.m128[3];
  local_4d8._0_4_ = fVar103 * auVar168._0_4_ + fVar159 * auVar196._0_4_ + fVar190 * auVar203._0_4_;
  local_4d8._4_4_ = fVar129 * auVar168._4_4_ + fVar185 * auVar196._4_4_ + fVar217 * auVar203._4_4_;
  fStack_4d0 = fVar243 * auVar168._8_4_ + fVar186 * auVar196._8_4_ + fVar220 * auVar203._8_4_;
  fStack_4cc = fVar130 * auVar168._12_4_ + fVar188 * auVar196._12_4_ + fVar222 * auVar203._12_4_;
  auVar61._4_4_ = fVar242;
  auVar61._0_4_ = fVar225;
  auVar61._8_4_ = fVar191;
  auVar61._12_4_ = fVar223;
  local_278 = vsubps_avx(auVar61,auVar118);
  auVar203 = vshufps_avx(local_278,local_278,0xaa);
  auVar196 = vmovshdup_avx(local_278);
  auVar168 = vmovsldup_avx(local_278);
  auVar350._0_8_ =
       CONCAT44(fVar129 * auVar168._4_4_ + fVar185 * auVar196._4_4_ + fVar217 * auVar203._4_4_,
                fVar103 * auVar168._0_4_ + fVar159 * auVar196._0_4_ + fVar190 * auVar203._0_4_);
  auVar350._8_4_ = fVar243 * auVar168._8_4_ + fVar186 * auVar196._8_4_ + fVar220 * auVar203._8_4_;
  auVar350._12_4_ =
       fVar130 * auVar168._12_4_ + fVar188 * auVar196._12_4_ + fVar222 * auVar203._12_4_;
  local_288 = vsubps_avx(_local_3d8,auVar118);
  auVar203 = vshufps_avx(local_288,local_288,0xaa);
  auVar196 = vmovshdup_avx(local_288);
  auVar168 = vmovsldup_avx(local_288);
  auVar334._0_4_ = fVar103 * auVar168._0_4_ + fVar159 * auVar196._0_4_ + fVar190 * auVar203._0_4_;
  auVar334._4_4_ = fVar129 * auVar168._4_4_ + fVar185 * auVar196._4_4_ + fVar217 * auVar203._4_4_;
  auVar334._8_4_ = fVar243 * auVar168._8_4_ + fVar186 * auVar196._8_4_ + fVar220 * auVar203._8_4_;
  auVar334._12_4_ =
       fVar130 * auVar168._12_4_ + fVar188 * auVar196._12_4_ + fVar222 * auVar203._12_4_;
  local_298 = vsubps_avx(_local_3e8,auVar118);
  auVar203 = vshufps_avx(local_298,local_298,0xaa);
  auVar196 = vmovshdup_avx(local_298);
  auVar168 = vmovsldup_avx(local_298);
  auVar112._0_4_ = auVar168._0_4_ * fVar103 + auVar196._0_4_ * fVar159 + fVar190 * auVar203._0_4_;
  auVar112._4_4_ = auVar168._4_4_ * fVar129 + auVar196._4_4_ * fVar185 + fVar217 * auVar203._4_4_;
  auVar112._8_4_ = auVar168._8_4_ * fVar243 + auVar196._8_4_ * fVar186 + fVar220 * auVar203._8_4_;
  auVar112._12_4_ =
       auVar168._12_4_ * fVar130 + auVar196._12_4_ * fVar188 + fVar222 * auVar203._12_4_;
  local_2a8 = vsubps_avx(_local_3f8,auVar118);
  auVar203 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar196 = vmovshdup_avx(local_2a8);
  auVar168 = vmovsldup_avx(local_2a8);
  auVar280._0_4_ = auVar168._0_4_ * fVar103 + auVar196._0_4_ * fVar159 + auVar203._0_4_ * fVar190;
  auVar280._4_4_ = auVar168._4_4_ * fVar129 + auVar196._4_4_ * fVar185 + auVar203._4_4_ * fVar217;
  auVar280._8_4_ = auVar168._8_4_ * fVar243 + auVar196._8_4_ * fVar186 + auVar203._8_4_ * fVar220;
  auVar280._12_4_ =
       auVar168._12_4_ * fVar130 + auVar196._12_4_ * fVar188 + auVar203._12_4_ * fVar222;
  auVar59._4_4_ = fVar187;
  auVar59._0_4_ = fVar240;
  auVar59._8_4_ = fVar218;
  auVar59._12_4_ = fVar101;
  local_2b8 = vsubps_avx(auVar59,auVar118);
  auVar203 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar196 = vmovshdup_avx(local_2b8);
  auVar168 = vmovsldup_avx(local_2b8);
  auVar293._0_4_ = auVar168._0_4_ * fVar103 + auVar196._0_4_ * fVar159 + auVar203._0_4_ * fVar190;
  auVar293._4_4_ = auVar168._4_4_ * fVar129 + auVar196._4_4_ * fVar185 + auVar203._4_4_ * fVar217;
  auVar293._8_4_ = auVar168._8_4_ * fVar243 + auVar196._8_4_ * fVar186 + auVar203._8_4_ * fVar220;
  auVar293._12_4_ =
       auVar168._12_4_ * fVar130 + auVar196._12_4_ * fVar188 + auVar203._12_4_ * fVar222;
  auVar57._4_4_ = fVar189;
  auVar57._0_4_ = fVar241;
  auVar57._8_4_ = fVar221;
  auVar57._12_4_ = fVar102;
  local_2c8 = vsubps_avx(auVar57,auVar118);
  auVar203 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar196 = vmovshdup_avx(local_2c8);
  auVar168 = vmovsldup_avx(local_2c8);
  auVar308._0_4_ = auVar168._0_4_ * fVar103 + auVar196._0_4_ * fVar159 + auVar203._0_4_ * fVar190;
  auVar308._4_4_ = auVar168._4_4_ * fVar129 + auVar196._4_4_ * fVar185 + auVar203._4_4_ * fVar217;
  auVar308._8_4_ = auVar168._8_4_ * fVar243 + auVar196._8_4_ * fVar186 + auVar203._8_4_ * fVar220;
  auVar308._12_4_ =
       auVar168._12_4_ * fVar130 + auVar196._12_4_ * fVar188 + auVar203._12_4_ * fVar222;
  local_2d8 = vsubps_avx(_local_408,auVar118);
  auVar168 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar118 = vmovshdup_avx(local_2d8);
  auVar196 = vmovsldup_avx(local_2d8);
  auVar92._0_4_ = fVar103 * auVar196._0_4_ + fVar159 * auVar118._0_4_ + fVar190 * auVar168._0_4_;
  auVar92._4_4_ = fVar129 * auVar196._4_4_ + fVar185 * auVar118._4_4_ + fVar217 * auVar168._4_4_;
  auVar92._8_4_ = fVar243 * auVar196._8_4_ + fVar186 * auVar118._8_4_ + fVar220 * auVar168._8_4_;
  auVar92._12_4_ = fVar130 * auVar196._12_4_ + fVar188 * auVar118._12_4_ + fVar222 * auVar168._12_4_
  ;
  auVar203 = vmovlhps_avx(_local_4d8,auVar280);
  auVar15 = vmovlhps_avx(auVar350,auVar293);
  auVar16 = vmovlhps_avx(auVar334,auVar308);
  _local_3b8 = vmovlhps_avx(auVar112,auVar92);
  auVar118 = vminps_avx(auVar203,auVar15);
  auVar196 = vminps_avx(auVar16,_local_3b8);
  auVar168 = vminps_avx(auVar118,auVar196);
  auVar118 = vmaxps_avx(auVar203,auVar15);
  auVar196 = vmaxps_avx(auVar16,_local_3b8);
  auVar118 = vmaxps_avx(auVar118,auVar196);
  auVar196 = vshufpd_avx(auVar168,auVar168,3);
  auVar168 = vminps_avx(auVar168,auVar196);
  auVar196 = vshufpd_avx(auVar118,auVar118,3);
  auVar196 = vmaxps_avx(auVar118,auVar196);
  auVar249._8_4_ = 0x7fffffff;
  auVar249._0_8_ = 0x7fffffff7fffffff;
  auVar249._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar168,auVar249);
  auVar196 = vandps_avx(auVar196,auVar249);
  auVar118 = vmaxps_avx(auVar118,auVar196);
  auVar196 = vmovshdup_avx(auVar118);
  auVar118 = vmaxss_avx(auVar196,auVar118);
  fVar129 = auVar118._0_4_ * 9.536743e-07;
  register0x00001548 = auVar350._0_8_;
  local_3a8 = auVar350._0_8_;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
  local_138._16_16_ = auVar118;
  local_138._0_16_ = auVar118;
  auVar93._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
  auVar93._8_4_ = auVar118._8_4_ ^ 0x80000000;
  auVar93._12_4_ = auVar118._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar93;
  local_158._0_16_ = auVar93;
  local_308 = vpshufd_avx(ZEXT416(*(uint *)(local_418 + 2)),0);
  local_318 = vpshufd_avx(ZEXT416(*(uint *)(local_418 + lVar71 * 4 + 6)),0);
  bVar66 = false;
  uVar70 = 0;
  fVar103 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar203);
  _local_248 = vsubps_avx(auVar16,auVar15);
  _local_258 = vsubps_avx(_local_3b8,auVar16);
  _local_328 = vsubps_avx(_local_3f8,_local_3c8);
  auVar60._4_4_ = fVar187;
  auVar60._0_4_ = fVar240;
  auVar60._8_4_ = fVar218;
  auVar60._12_4_ = fVar101;
  auVar62._4_4_ = fVar242;
  auVar62._0_4_ = fVar225;
  auVar62._8_4_ = fVar191;
  auVar62._12_4_ = fVar223;
  _local_338 = vsubps_avx(auVar60,auVar62);
  auVar58._4_4_ = fVar189;
  auVar58._0_4_ = fVar241;
  auVar58._8_4_ = fVar221;
  auVar58._12_4_ = fVar102;
  _local_348 = vsubps_avx(auVar58,_local_3d8);
  _local_358 = vsubps_avx(_local_408,_local_3e8);
  _local_5b8 = ZEXT816(0x3f80000000000000);
  local_2e8 = _local_5b8;
  do {
    auVar118 = vshufps_avx(_local_5b8,_local_5b8,0x50);
    auVar364._8_4_ = 0x3f800000;
    auVar364._0_8_ = &DAT_3f8000003f800000;
    auVar364._12_4_ = 0x3f800000;
    auVar367._16_4_ = 0x3f800000;
    auVar367._0_16_ = auVar364;
    auVar367._20_4_ = 0x3f800000;
    auVar367._24_4_ = 0x3f800000;
    auVar367._28_4_ = 0x3f800000;
    auVar196 = vsubps_avx(auVar364,auVar118);
    fVar243 = auVar118._0_4_;
    fVar130 = auVar118._4_4_;
    fVar159 = auVar118._8_4_;
    fVar185 = auVar118._12_4_;
    fVar186 = auVar196._0_4_;
    fVar188 = auVar196._4_4_;
    fVar190 = auVar196._8_4_;
    fVar217 = auVar196._12_4_;
    auVar144._0_4_ = auVar280._0_4_ * fVar243 + fVar186 * (float)local_4d8._0_4_;
    auVar144._4_4_ = auVar280._4_4_ * fVar130 + fVar188 * (float)local_4d8._4_4_;
    auVar144._8_4_ = auVar280._0_4_ * fVar159 + fVar190 * (float)local_4d8._0_4_;
    auVar144._12_4_ = auVar280._4_4_ * fVar185 + fVar217 * (float)local_4d8._4_4_;
    auVar113._0_4_ = auVar293._0_4_ * fVar243 + local_3a8._0_4_ * fVar186;
    auVar113._4_4_ = auVar293._4_4_ * fVar130 + local_3a8._4_4_ * fVar188;
    auVar113._8_4_ = auVar293._0_4_ * fVar159 + local_3a8._8_4_ * fVar190;
    auVar113._12_4_ = auVar293._4_4_ * fVar185 + local_3a8._12_4_ * fVar217;
    auVar206._0_4_ = auVar308._0_4_ * fVar243 + auVar334._0_4_ * fVar186;
    auVar206._4_4_ = auVar308._4_4_ * fVar130 + auVar334._4_4_ * fVar188;
    auVar206._8_4_ = auVar308._0_4_ * fVar159 + auVar334._0_4_ * fVar190;
    auVar206._12_4_ = auVar308._4_4_ * fVar185 + auVar334._4_4_ * fVar217;
    auVar169._0_4_ = auVar92._0_4_ * fVar243 + auVar112._0_4_ * fVar186;
    auVar169._4_4_ = auVar92._4_4_ * fVar130 + auVar112._4_4_ * fVar188;
    auVar169._8_4_ = auVar92._0_4_ * fVar159 + auVar112._0_4_ * fVar190;
    auVar169._12_4_ = auVar92._4_4_ * fVar185 + auVar112._4_4_ * fVar217;
    auVar118 = vmovshdup_avx(local_2e8);
    auVar196 = vshufps_avx(local_2e8,local_2e8,0);
    auVar289._16_16_ = auVar196;
    auVar289._0_16_ = auVar196;
    auVar168 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar98._16_16_ = auVar168;
    auVar98._0_16_ = auVar168;
    auVar97 = vsubps_avx(auVar98,auVar289);
    auVar168 = vshufps_avx(auVar144,auVar144,0);
    auVar177 = vshufps_avx(auVar144,auVar144,0x55);
    auVar117 = vshufps_avx(auVar113,auVar113,0);
    auVar176 = vshufps_avx(auVar113,auVar113,0x55);
    auVar94 = vshufps_avx(auVar206,auVar206,0);
    auVar145 = vshufps_avx(auVar206,auVar206,0x55);
    auVar17 = vshufps_avx(auVar169,auVar169,0);
    auVar78 = vshufps_avx(auVar169,auVar169,0x55);
    auVar118 = ZEXT416((uint)((auVar118._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar118 = vshufps_avx(auVar118,auVar118,0);
    auVar302._0_4_ = auVar196._0_4_ + auVar97._0_4_ * 0.0;
    auVar302._4_4_ = auVar196._4_4_ + auVar97._4_4_ * 0.14285715;
    auVar302._8_4_ = auVar196._8_4_ + auVar97._8_4_ * 0.2857143;
    auVar302._12_4_ = auVar196._12_4_ + auVar97._12_4_ * 0.42857146;
    auVar302._16_4_ = auVar196._0_4_ + auVar97._16_4_ * 0.5714286;
    auVar302._20_4_ = auVar196._4_4_ + auVar97._20_4_ * 0.71428573;
    auVar302._24_4_ = auVar196._8_4_ + auVar97._24_4_ * 0.8571429;
    auVar302._28_4_ = auVar196._12_4_ + auVar97._28_4_;
    auVar20 = vsubps_avx(auVar367,auVar302);
    fVar305 = auVar117._0_4_;
    fVar291 = auVar117._4_4_;
    fVar219 = auVar117._8_4_;
    fVar224 = auVar117._12_4_;
    fVar243 = auVar20._0_4_;
    fVar186 = auVar20._4_4_;
    fVar220 = auVar20._8_4_;
    fVar304 = auVar20._12_4_;
    fVar355 = auVar168._12_4_;
    fVar131 = auVar20._16_4_;
    fVar156 = auVar20._20_4_;
    fVar157 = auVar20._24_4_;
    fVar255 = auVar176._0_4_;
    fVar256 = auVar176._4_4_;
    fVar257 = auVar176._8_4_;
    fVar345 = auVar176._12_4_;
    local_548 = auVar177._0_4_;
    fStack_544 = auVar177._4_4_;
    fStack_540 = auVar177._8_4_;
    fStack_53c = auVar177._12_4_;
    fVar130 = auVar94._0_4_;
    fVar185 = auVar94._4_4_;
    fVar190 = auVar94._8_4_;
    fVar222 = auVar94._12_4_;
    fVar314 = auVar302._0_4_ * fVar130 + fVar305 * fVar243;
    fVar322 = auVar302._4_4_ * fVar185 + fVar291 * fVar186;
    fVar323 = auVar302._8_4_ * fVar190 + fVar219 * fVar220;
    fVar324 = auVar302._12_4_ * fVar222 + fVar224 * fVar304;
    fVar325 = auVar302._16_4_ * fVar130 + fVar305 * fVar131;
    fVar326 = auVar302._20_4_ * fVar185 + fVar291 * fVar156;
    fVar327 = auVar302._24_4_ * fVar190 + fVar219 * fVar157;
    fVar159 = auVar145._0_4_;
    fVar188 = auVar145._4_4_;
    fVar217 = auVar145._8_4_;
    fVar303 = auVar145._12_4_;
    fVar328 = auVar302._0_4_ * fVar159 + fVar255 * fVar243;
    fVar336 = auVar302._4_4_ * fVar188 + fVar256 * fVar186;
    fVar337 = auVar302._8_4_ * fVar217 + fVar257 * fVar220;
    fVar338 = auVar302._12_4_ * fVar303 + fVar345 * fVar304;
    fVar339 = auVar302._16_4_ * fVar159 + fVar255 * fVar131;
    fVar341 = auVar302._20_4_ * fVar188 + fVar256 * fVar156;
    fVar343 = auVar302._24_4_ * fVar217 + fVar257 * fVar157;
    auVar196 = vshufps_avx(auVar144,auVar144,0xaa);
    auVar177 = vshufps_avx(auVar144,auVar144,0xff);
    fVar158 = fVar222 + 0.0;
    auVar117 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar176 = vshufps_avx(auVar113,auVar113,0xff);
    auVar99._0_4_ =
         fVar243 * (fVar305 * auVar302._0_4_ + auVar168._0_4_ * fVar243) + auVar302._0_4_ * fVar314;
    auVar99._4_4_ =
         fVar186 * (fVar291 * auVar302._4_4_ + auVar168._4_4_ * fVar186) + auVar302._4_4_ * fVar322;
    auVar99._8_4_ =
         fVar220 * (fVar219 * auVar302._8_4_ + auVar168._8_4_ * fVar220) + auVar302._8_4_ * fVar323;
    auVar99._12_4_ =
         fVar304 * (fVar224 * auVar302._12_4_ + fVar355 * fVar304) + auVar302._12_4_ * fVar324;
    auVar99._16_4_ =
         fVar131 * (fVar305 * auVar302._16_4_ + auVar168._0_4_ * fVar131) +
         auVar302._16_4_ * fVar325;
    auVar99._20_4_ =
         fVar156 * (fVar291 * auVar302._20_4_ + auVar168._4_4_ * fVar156) +
         auVar302._20_4_ * fVar326;
    auVar99._24_4_ =
         fVar157 * (fVar219 * auVar302._24_4_ + auVar168._8_4_ * fVar157) +
         auVar302._24_4_ * fVar327;
    auVar99._28_4_ = fVar355 + 1.0 + fVar303;
    auVar181._0_4_ =
         fVar243 * (fVar255 * auVar302._0_4_ + fVar243 * local_548) + auVar302._0_4_ * fVar328;
    auVar181._4_4_ =
         fVar186 * (fVar256 * auVar302._4_4_ + fVar186 * fStack_544) + auVar302._4_4_ * fVar336;
    auVar181._8_4_ =
         fVar220 * (fVar257 * auVar302._8_4_ + fVar220 * fStack_540) + auVar302._8_4_ * fVar337;
    auVar181._12_4_ =
         fVar304 * (fVar345 * auVar302._12_4_ + fVar304 * fStack_53c) + auVar302._12_4_ * fVar338;
    auVar181._16_4_ =
         fVar131 * (fVar255 * auVar302._16_4_ + fVar131 * local_548) + auVar302._16_4_ * fVar339;
    auVar181._20_4_ =
         fVar156 * (fVar256 * auVar302._20_4_ + fVar156 * fStack_544) + auVar302._20_4_ * fVar341;
    auVar181._24_4_ =
         fVar157 * (fVar257 * auVar302._24_4_ + fVar157 * fStack_540) + auVar302._24_4_ * fVar343;
    auVar181._28_4_ = fVar355 + 1.0 + fVar303;
    auVar214._0_4_ =
         fVar243 * fVar314 + auVar302._0_4_ * (auVar17._0_4_ * auVar302._0_4_ + fVar243 * fVar130);
    auVar214._4_4_ =
         fVar186 * fVar322 + auVar302._4_4_ * (auVar17._4_4_ * auVar302._4_4_ + fVar186 * fVar185);
    auVar214._8_4_ =
         fVar220 * fVar323 + auVar302._8_4_ * (auVar17._8_4_ * auVar302._8_4_ + fVar220 * fVar190);
    auVar214._12_4_ =
         fVar304 * fVar324 +
         auVar302._12_4_ * (auVar17._12_4_ * auVar302._12_4_ + fVar304 * fVar222);
    auVar214._16_4_ =
         fVar131 * fVar325 + auVar302._16_4_ * (auVar17._0_4_ * auVar302._16_4_ + fVar131 * fVar130)
    ;
    auVar214._20_4_ =
         fVar156 * fVar326 + auVar302._20_4_ * (auVar17._4_4_ * auVar302._20_4_ + fVar156 * fVar185)
    ;
    auVar214._24_4_ =
         fVar157 * fVar327 + auVar302._24_4_ * (auVar17._8_4_ * auVar302._24_4_ + fVar157 * fVar190)
    ;
    auVar214._28_4_ = fVar303 + fVar158;
    auVar313._0_4_ =
         fVar243 * fVar328 + auVar302._0_4_ * (auVar78._0_4_ * auVar302._0_4_ + fVar243 * fVar159);
    auVar313._4_4_ =
         fVar186 * fVar336 + auVar302._4_4_ * (auVar78._4_4_ * auVar302._4_4_ + fVar186 * fVar188);
    auVar313._8_4_ =
         fVar220 * fVar337 + auVar302._8_4_ * (auVar78._8_4_ * auVar302._8_4_ + fVar220 * fVar217);
    auVar313._12_4_ =
         fVar304 * fVar338 +
         auVar302._12_4_ * (auVar78._12_4_ * auVar302._12_4_ + fVar304 * fVar303);
    auVar313._16_4_ =
         fVar131 * fVar339 + auVar302._16_4_ * (auVar78._0_4_ * auVar302._16_4_ + fVar131 * fVar159)
    ;
    auVar313._20_4_ =
         fVar156 * fVar341 + auVar302._20_4_ * (auVar78._4_4_ * auVar302._20_4_ + fVar156 * fVar188)
    ;
    auVar313._24_4_ =
         fVar157 * fVar343 + auVar302._24_4_ * (auVar78._8_4_ * auVar302._24_4_ + fVar157 * fVar217)
    ;
    auVar313._28_4_ = fVar158 + fVar303 + 0.0;
    local_78._0_4_ = fVar243 * auVar99._0_4_ + auVar302._0_4_ * auVar214._0_4_;
    local_78._4_4_ = fVar186 * auVar99._4_4_ + auVar302._4_4_ * auVar214._4_4_;
    local_78._8_4_ = fVar220 * auVar99._8_4_ + auVar302._8_4_ * auVar214._8_4_;
    local_78._12_4_ = fVar304 * auVar99._12_4_ + auVar302._12_4_ * auVar214._12_4_;
    local_78._16_4_ = fVar131 * auVar99._16_4_ + auVar302._16_4_ * auVar214._16_4_;
    local_78._20_4_ = fVar156 * auVar99._20_4_ + auVar302._20_4_ * auVar214._20_4_;
    local_78._24_4_ = fVar157 * auVar99._24_4_ + auVar302._24_4_ * auVar214._24_4_;
    local_78._28_4_ = fVar355 + fVar224 + fVar303 + 0.0;
    local_98._0_4_ = fVar243 * auVar181._0_4_ + auVar302._0_4_ * auVar313._0_4_;
    local_98._4_4_ = fVar186 * auVar181._4_4_ + auVar302._4_4_ * auVar313._4_4_;
    local_98._8_4_ = fVar220 * auVar181._8_4_ + auVar302._8_4_ * auVar313._8_4_;
    local_98._12_4_ = fVar304 * auVar181._12_4_ + auVar302._12_4_ * auVar313._12_4_;
    local_98._16_4_ = fVar131 * auVar181._16_4_ + auVar302._16_4_ * auVar313._16_4_;
    local_98._20_4_ = fVar156 * auVar181._20_4_ + auVar302._20_4_ * auVar313._20_4_;
    local_98._24_4_ = fVar157 * auVar181._24_4_ + auVar302._24_4_ * auVar313._24_4_;
    local_98._28_4_ = fVar355 + fVar224 + fVar158;
    auVar21 = vsubps_avx(auVar214,auVar99);
    auVar97 = vsubps_avx(auVar313,auVar181);
    local_588._0_4_ = auVar118._0_4_;
    local_588._4_4_ = auVar118._4_4_;
    fStack_580 = auVar118._8_4_;
    fStack_57c = auVar118._12_4_;
    local_d8 = (float)local_588._0_4_ * auVar21._0_4_ * 3.0;
    fStack_d4 = (float)local_588._4_4_ * auVar21._4_4_ * 3.0;
    auVar22._4_4_ = fStack_d4;
    auVar22._0_4_ = local_d8;
    fStack_d0 = fStack_580 * auVar21._8_4_ * 3.0;
    auVar22._8_4_ = fStack_d0;
    fStack_cc = fStack_57c * auVar21._12_4_ * 3.0;
    auVar22._12_4_ = fStack_cc;
    fStack_c8 = (float)local_588._0_4_ * auVar21._16_4_ * 3.0;
    auVar22._16_4_ = fStack_c8;
    fStack_c4 = (float)local_588._4_4_ * auVar21._20_4_ * 3.0;
    auVar22._20_4_ = fStack_c4;
    fStack_c0 = fStack_580 * auVar21._24_4_ * 3.0;
    auVar22._24_4_ = fStack_c0;
    auVar22._28_4_ = auVar21._28_4_;
    fVar322 = (float)local_588._0_4_ * auVar97._0_4_ * 3.0;
    fVar219 = (float)local_588._4_4_ * auVar97._4_4_ * 3.0;
    auVar23._4_4_ = fVar219;
    auVar23._0_4_ = fVar322;
    fVar323 = fStack_580 * auVar97._8_4_ * 3.0;
    auVar23._8_4_ = fVar323;
    fVar224 = fStack_57c * auVar97._12_4_ * 3.0;
    auVar23._12_4_ = fVar224;
    fVar324 = (float)local_588._0_4_ * auVar97._16_4_ * 3.0;
    auVar23._16_4_ = fVar324;
    fVar325 = (float)local_588._4_4_ * auVar97._20_4_ * 3.0;
    auVar23._20_4_ = fVar325;
    fVar326 = fStack_580 * auVar97._24_4_ * 3.0;
    auVar23._24_4_ = fVar326;
    auVar23._28_4_ = auVar214._28_4_;
    auVar22 = vsubps_avx(local_78,auVar22);
    auVar97 = vperm2f128_avx(auVar22,auVar22,1);
    auVar97 = vshufps_avx(auVar97,auVar22,0x30);
    auVar97 = vshufps_avx(auVar22,auVar97,0x29);
    auVar23 = vsubps_avx(local_98,auVar23);
    auVar22 = vperm2f128_avx(auVar23,auVar23,1);
    auVar22 = vshufps_avx(auVar22,auVar23,0x30);
    auVar98 = vshufps_avx(auVar23,auVar22,0x29);
    fVar357 = auVar117._0_4_;
    fVar361 = auVar117._4_4_;
    fVar362 = auVar117._8_4_;
    fVar130 = auVar176._0_4_;
    fVar188 = auVar176._4_4_;
    fVar222 = auVar176._8_4_;
    fVar305 = auVar176._12_4_;
    fVar356 = auVar177._12_4_;
    auVar118 = vshufps_avx(auVar206,auVar206,0xaa);
    fVar159 = auVar118._0_4_;
    fVar190 = auVar118._4_4_;
    fVar303 = auVar118._8_4_;
    fVar314 = auVar118._12_4_;
    fVar338 = auVar302._0_4_ * fVar159 + fVar357 * fVar243;
    fVar339 = auVar302._4_4_ * fVar190 + fVar361 * fVar186;
    fVar341 = auVar302._8_4_ * fVar303 + fVar362 * fVar220;
    fVar343 = auVar302._12_4_ * fVar314 + auVar117._12_4_ * fVar304;
    fVar340 = auVar302._16_4_ * fVar159 + fVar357 * fVar131;
    fVar342 = auVar302._20_4_ * fVar190 + fVar361 * fVar156;
    fVar344 = auVar302._24_4_ * fVar303 + fVar362 * fVar157;
    fVar345 = fVar356 + fVar355 + fVar345;
    auVar118 = vshufps_avx(auVar206,auVar206,0xff);
    fVar185 = auVar118._0_4_;
    fVar217 = auVar118._4_4_;
    fVar158 = auVar118._8_4_;
    fVar291 = auVar118._12_4_;
    fVar327 = auVar302._0_4_ * fVar185 + fVar243 * fVar130;
    fVar255 = auVar302._4_4_ * fVar217 + fVar186 * fVar188;
    fVar328 = auVar302._8_4_ * fVar158 + fVar220 * fVar222;
    fVar256 = auVar302._12_4_ * fVar291 + fVar304 * fVar305;
    fVar336 = auVar302._16_4_ * fVar185 + fVar131 * fVar130;
    fVar257 = auVar302._20_4_ * fVar217 + fVar156 * fVar188;
    fVar337 = auVar302._24_4_ * fVar158 + fVar157 * fVar222;
    auVar118 = vshufps_avx(auVar169,auVar169,0xaa);
    auVar168 = vshufps_avx(auVar169,auVar169,0xff);
    fVar355 = auVar168._12_4_;
    auVar100._0_4_ =
         auVar302._0_4_ * fVar338 + fVar243 * (fVar357 * auVar302._0_4_ + auVar196._0_4_ * fVar243);
    auVar100._4_4_ =
         auVar302._4_4_ * fVar339 + fVar186 * (fVar361 * auVar302._4_4_ + auVar196._4_4_ * fVar186);
    auVar100._8_4_ =
         auVar302._8_4_ * fVar341 + fVar220 * (fVar362 * auVar302._8_4_ + auVar196._8_4_ * fVar220);
    auVar100._12_4_ =
         auVar302._12_4_ * fVar343 +
         fVar304 * (auVar117._12_4_ * auVar302._12_4_ + auVar196._12_4_ * fVar304);
    auVar100._16_4_ =
         auVar302._16_4_ * fVar340 +
         fVar131 * (fVar357 * auVar302._16_4_ + auVar196._0_4_ * fVar131);
    auVar100._20_4_ =
         auVar302._20_4_ * fVar342 +
         fVar156 * (fVar361 * auVar302._20_4_ + auVar196._4_4_ * fVar156);
    auVar100._24_4_ =
         auVar302._24_4_ * fVar344 +
         fVar157 * (fVar362 * auVar302._24_4_ + auVar196._8_4_ * fVar157);
    auVar100._28_4_ = fVar355 + auVar23._28_4_ + auVar22._28_4_;
    auVar354._0_4_ =
         auVar302._0_4_ * fVar327 + fVar243 * (auVar302._0_4_ * fVar130 + auVar177._0_4_ * fVar243);
    auVar354._4_4_ =
         auVar302._4_4_ * fVar255 + fVar186 * (auVar302._4_4_ * fVar188 + auVar177._4_4_ * fVar186);
    auVar354._8_4_ =
         auVar302._8_4_ * fVar328 + fVar220 * (auVar302._8_4_ * fVar222 + auVar177._8_4_ * fVar220);
    auVar354._12_4_ =
         auVar302._12_4_ * fVar256 + fVar304 * (auVar302._12_4_ * fVar305 + fVar356 * fVar304);
    auVar354._16_4_ =
         auVar302._16_4_ * fVar336 +
         fVar131 * (auVar302._16_4_ * fVar130 + auVar177._0_4_ * fVar131);
    auVar354._20_4_ =
         auVar302._20_4_ * fVar257 +
         fVar156 * (auVar302._20_4_ * fVar188 + auVar177._4_4_ * fVar156);
    auVar354._24_4_ =
         auVar302._24_4_ * fVar337 +
         fVar157 * (auVar302._24_4_ * fVar222 + auVar177._8_4_ * fVar157);
    auVar354._28_4_ = fVar355 + auVar22._28_4_ + auVar214._28_4_;
    auVar22 = vperm2f128_avx(local_78,local_78,1);
    auVar22 = vshufps_avx(auVar22,local_78,0x30);
    auVar99 = vshufps_avx(local_78,auVar22,0x29);
    auVar215._0_4_ =
         fVar243 * fVar338 + auVar302._0_4_ * (auVar118._0_4_ * auVar302._0_4_ + fVar243 * fVar159);
    auVar215._4_4_ =
         fVar186 * fVar339 + auVar302._4_4_ * (auVar118._4_4_ * auVar302._4_4_ + fVar186 * fVar190);
    auVar215._8_4_ =
         fVar220 * fVar341 + auVar302._8_4_ * (auVar118._8_4_ * auVar302._8_4_ + fVar220 * fVar303);
    auVar215._12_4_ =
         fVar304 * fVar343 +
         auVar302._12_4_ * (auVar118._12_4_ * auVar302._12_4_ + fVar304 * fVar314);
    auVar215._16_4_ =
         fVar131 * fVar340 +
         auVar302._16_4_ * (auVar118._0_4_ * auVar302._16_4_ + fVar131 * fVar159);
    auVar215._20_4_ =
         fVar156 * fVar342 +
         auVar302._20_4_ * (auVar118._4_4_ * auVar302._20_4_ + fVar156 * fVar190);
    auVar215._24_4_ =
         fVar157 * fVar344 +
         auVar302._24_4_ * (auVar118._8_4_ * auVar302._24_4_ + fVar157 * fVar303);
    auVar215._28_4_ = fVar345 + auVar118._12_4_ + fVar314;
    auVar254._0_4_ =
         fVar243 * fVar327 + auVar302._0_4_ * (auVar168._0_4_ * auVar302._0_4_ + fVar243 * fVar185);
    auVar254._4_4_ =
         fVar186 * fVar255 + auVar302._4_4_ * (auVar168._4_4_ * auVar302._4_4_ + fVar186 * fVar217);
    auVar254._8_4_ =
         fVar220 * fVar328 + auVar302._8_4_ * (auVar168._8_4_ * auVar302._8_4_ + fVar220 * fVar158);
    auVar254._12_4_ =
         fVar304 * fVar256 + auVar302._12_4_ * (fVar355 * auVar302._12_4_ + fVar304 * fVar291);
    auVar254._16_4_ =
         fVar131 * fVar336 +
         auVar302._16_4_ * (auVar168._0_4_ * auVar302._16_4_ + fVar131 * fVar185);
    auVar254._20_4_ =
         fVar156 * fVar257 +
         auVar302._20_4_ * (auVar168._4_4_ * auVar302._20_4_ + fVar156 * fVar217);
    auVar254._24_4_ =
         fVar157 * fVar337 +
         auVar302._24_4_ * (auVar168._8_4_ * auVar302._24_4_ + fVar157 * fVar158);
    auVar254._28_4_ = fVar356 + fVar305 + fVar355 + fVar291;
    auVar269._0_4_ = fVar243 * auVar100._0_4_ + auVar302._0_4_ * auVar215._0_4_;
    auVar269._4_4_ = fVar186 * auVar100._4_4_ + auVar302._4_4_ * auVar215._4_4_;
    auVar269._8_4_ = fVar220 * auVar100._8_4_ + auVar302._8_4_ * auVar215._8_4_;
    auVar269._12_4_ = fVar304 * auVar100._12_4_ + auVar302._12_4_ * auVar215._12_4_;
    auVar269._16_4_ = fVar131 * auVar100._16_4_ + auVar302._16_4_ * auVar215._16_4_;
    auVar269._20_4_ = fVar156 * auVar100._20_4_ + auVar302._20_4_ * auVar215._20_4_;
    auVar269._24_4_ = fVar157 * auVar100._24_4_ + auVar302._24_4_ * auVar215._24_4_;
    auVar269._28_4_ = fVar345 + fVar355 + fVar291;
    auVar290._0_4_ = fVar243 * auVar354._0_4_ + auVar302._0_4_ * auVar254._0_4_;
    auVar290._4_4_ = fVar186 * auVar354._4_4_ + auVar302._4_4_ * auVar254._4_4_;
    auVar290._8_4_ = fVar220 * auVar354._8_4_ + auVar302._8_4_ * auVar254._8_4_;
    auVar290._12_4_ = fVar304 * auVar354._12_4_ + auVar302._12_4_ * auVar254._12_4_;
    auVar290._16_4_ = fVar131 * auVar354._16_4_ + auVar302._16_4_ * auVar254._16_4_;
    auVar290._20_4_ = fVar156 * auVar354._20_4_ + auVar302._20_4_ * auVar254._20_4_;
    auVar290._24_4_ = fVar157 * auVar354._24_4_ + auVar302._24_4_ * auVar254._24_4_;
    auVar290._28_4_ = auVar20._28_4_ + auVar302._28_4_;
    auVar22 = vsubps_avx(auVar215,auVar100);
    auVar20 = vsubps_avx(auVar254,auVar354);
    local_f8 = (float)local_588._0_4_ * auVar22._0_4_ * 3.0;
    fStack_f4 = (float)local_588._4_4_ * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_f4;
    auVar18._0_4_ = local_f8;
    fStack_f0 = fStack_580 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_f0;
    fStack_ec = fStack_57c * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_ec;
    fStack_e8 = (float)local_588._0_4_ * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_e8;
    fStack_e4 = (float)local_588._4_4_ * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_e4;
    fStack_e0 = fStack_580 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_e0;
    auVar18._28_4_ = auVar254._28_4_;
    local_118 = (float)local_588._0_4_ * auVar20._0_4_ * 3.0;
    fStack_114 = (float)local_588._4_4_ * auVar20._4_4_ * 3.0;
    auVar19._4_4_ = fStack_114;
    auVar19._0_4_ = local_118;
    fStack_110 = fStack_580 * auVar20._8_4_ * 3.0;
    auVar19._8_4_ = fStack_110;
    fStack_10c = fStack_57c * auVar20._12_4_ * 3.0;
    auVar19._12_4_ = fStack_10c;
    local_588._0_4_ = (float)local_588._0_4_ * auVar20._16_4_ * 3.0;
    auVar19._16_4_ = local_588._0_4_;
    local_588._4_4_ = (float)local_588._4_4_ * auVar20._20_4_ * 3.0;
    auVar19._20_4_ = local_588._4_4_;
    fStack_580 = fStack_580 * auVar20._24_4_ * 3.0;
    auVar19._24_4_ = fStack_580;
    auVar19._28_4_ = fStack_57c;
    auVar22 = vperm2f128_avx(auVar269,auVar269,1);
    auVar22 = vshufps_avx(auVar22,auVar269,0x30);
    auVar100 = vshufps_avx(auVar269,auVar22,0x29);
    auVar20 = vsubps_avx(auVar269,auVar18);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar18 = vshufps_avx(auVar20,auVar22,0x29);
    auVar20 = vsubps_avx(auVar290,auVar19);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar19 = vshufps_avx(auVar20,auVar22,0x29);
    auVar23 = vsubps_avx(auVar269,local_78);
    auVar24 = vsubps_avx(auVar100,auVar99);
    fVar243 = auVar24._0_4_ + auVar23._0_4_;
    fVar130 = auVar24._4_4_ + auVar23._4_4_;
    fVar159 = auVar24._8_4_ + auVar23._8_4_;
    fVar185 = auVar24._12_4_ + auVar23._12_4_;
    fVar186 = auVar24._16_4_ + auVar23._16_4_;
    fVar188 = auVar24._20_4_ + auVar23._20_4_;
    fVar190 = auVar24._24_4_ + auVar23._24_4_;
    auVar20 = vperm2f128_avx(local_98,local_98,1);
    auVar20 = vshufps_avx(auVar20,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar290,auVar290,1);
    auVar20 = vshufps_avx(auVar20,auVar290,0x30);
    auVar181 = vshufps_avx(auVar290,auVar20,0x29);
    auVar20 = vsubps_avx(auVar290,local_98);
    auVar215 = vsubps_avx(auVar181,local_b8);
    fVar217 = auVar20._0_4_ + auVar215._0_4_;
    fVar220 = auVar20._4_4_ + auVar215._4_4_;
    fVar222 = auVar20._8_4_ + auVar215._8_4_;
    fVar303 = auVar20._12_4_ + auVar215._12_4_;
    fVar158 = auVar20._16_4_ + auVar215._16_4_;
    fVar304 = auVar20._20_4_ + auVar215._20_4_;
    fVar305 = auVar20._24_4_ + auVar215._24_4_;
    fVar314 = auVar20._28_4_;
    auVar20._4_4_ = local_98._4_4_ * fVar130;
    auVar20._0_4_ = local_98._0_4_ * fVar243;
    auVar20._8_4_ = local_98._8_4_ * fVar159;
    auVar20._12_4_ = local_98._12_4_ * fVar185;
    auVar20._16_4_ = local_98._16_4_ * fVar186;
    auVar20._20_4_ = local_98._20_4_ * fVar188;
    auVar20._24_4_ = local_98._24_4_ * fVar190;
    auVar20._28_4_ = fVar314;
    auVar25._4_4_ = fVar220 * local_78._4_4_;
    auVar25._0_4_ = fVar217 * local_78._0_4_;
    auVar25._8_4_ = fVar222 * local_78._8_4_;
    auVar25._12_4_ = fVar303 * local_78._12_4_;
    auVar25._16_4_ = fVar158 * local_78._16_4_;
    auVar25._20_4_ = fVar304 * local_78._20_4_;
    auVar25._24_4_ = fVar305 * local_78._24_4_;
    auVar25._28_4_ = auVar22._28_4_;
    auVar20 = vsubps_avx(auVar20,auVar25);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar21._28_4_;
    fVar322 = local_98._0_4_ + fVar322;
    fVar219 = local_98._4_4_ + fVar219;
    fVar323 = local_98._8_4_ + fVar323;
    fVar224 = local_98._12_4_ + fVar224;
    fVar324 = local_98._16_4_ + fVar324;
    fVar325 = local_98._20_4_ + fVar325;
    fVar326 = local_98._24_4_ + fVar326;
    auVar21._4_4_ = fVar219 * fVar130;
    auVar21._0_4_ = fVar322 * fVar243;
    auVar21._8_4_ = fVar323 * fVar159;
    auVar21._12_4_ = fVar224 * fVar185;
    auVar21._16_4_ = fVar324 * fVar186;
    auVar21._20_4_ = fVar325 * fVar188;
    auVar21._24_4_ = fVar326 * fVar190;
    auVar21._28_4_ = fVar314;
    auVar26._4_4_ = fVar220 * fStack_d4;
    auVar26._0_4_ = fVar217 * local_d8;
    auVar26._8_4_ = fVar222 * fStack_d0;
    auVar26._12_4_ = fVar303 * fStack_cc;
    auVar26._16_4_ = fVar158 * fStack_c8;
    auVar26._20_4_ = fVar304 * fStack_c4;
    auVar26._24_4_ = fVar305 * fStack_c0;
    auVar26._28_4_ = fStack_bc;
    auVar21 = vsubps_avx(auVar21,auVar26);
    auVar27._4_4_ = auVar98._4_4_ * fVar130;
    auVar27._0_4_ = auVar98._0_4_ * fVar243;
    auVar27._8_4_ = auVar98._8_4_ * fVar159;
    auVar27._12_4_ = auVar98._12_4_ * fVar185;
    auVar27._16_4_ = auVar98._16_4_ * fVar186;
    auVar27._20_4_ = auVar98._20_4_ * fVar188;
    auVar27._24_4_ = auVar98._24_4_ * fVar190;
    auVar27._28_4_ = fVar314;
    local_548 = auVar97._0_4_;
    fStack_544 = auVar97._4_4_;
    fStack_540 = auVar97._8_4_;
    fStack_53c = auVar97._12_4_;
    fStack_538 = auVar97._16_4_;
    fStack_534 = auVar97._20_4_;
    fStack_530 = auVar97._24_4_;
    auVar28._4_4_ = fVar220 * fStack_544;
    auVar28._0_4_ = fVar217 * local_548;
    auVar28._8_4_ = fVar222 * fStack_540;
    auVar28._12_4_ = fVar303 * fStack_53c;
    auVar28._16_4_ = fVar158 * fStack_538;
    auVar28._20_4_ = fVar304 * fStack_534;
    auVar28._24_4_ = fVar305 * fStack_530;
    auVar28._28_4_ = 0x40400000;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_b8._4_4_ * fVar130;
    auVar29._0_4_ = local_b8._0_4_ * fVar243;
    auVar29._8_4_ = local_b8._8_4_ * fVar159;
    auVar29._12_4_ = local_b8._12_4_ * fVar185;
    auVar29._16_4_ = local_b8._16_4_ * fVar186;
    auVar29._20_4_ = local_b8._20_4_ * fVar188;
    auVar29._24_4_ = local_b8._24_4_ * fVar190;
    auVar29._28_4_ = fVar314;
    auVar30._4_4_ = auVar99._4_4_ * fVar220;
    auVar30._0_4_ = auVar99._0_4_ * fVar217;
    auVar30._8_4_ = auVar99._8_4_ * fVar222;
    auVar30._12_4_ = auVar99._12_4_ * fVar303;
    auVar30._16_4_ = auVar99._16_4_ * fVar158;
    auVar30._20_4_ = auVar99._20_4_ * fVar304;
    auVar30._24_4_ = auVar99._24_4_ * fVar305;
    auVar30._28_4_ = local_b8._28_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar290._4_4_ * fVar130;
    auVar31._0_4_ = auVar290._0_4_ * fVar243;
    auVar31._8_4_ = auVar290._8_4_ * fVar159;
    auVar31._12_4_ = auVar290._12_4_ * fVar185;
    auVar31._16_4_ = auVar290._16_4_ * fVar186;
    auVar31._20_4_ = auVar290._20_4_ * fVar188;
    auVar31._24_4_ = auVar290._24_4_ * fVar190;
    auVar31._28_4_ = fVar314;
    auVar32._4_4_ = fVar220 * auVar269._4_4_;
    auVar32._0_4_ = fVar217 * auVar269._0_4_;
    auVar32._8_4_ = fVar222 * auVar269._8_4_;
    auVar32._12_4_ = fVar303 * auVar269._12_4_;
    auVar32._16_4_ = fVar158 * auVar269._16_4_;
    auVar32._20_4_ = fVar304 * auVar269._20_4_;
    auVar32._24_4_ = fVar305 * auVar269._24_4_;
    auVar32._28_4_ = auVar98._28_4_;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_f8 = auVar269._0_4_ + local_f8;
    fStack_f4 = auVar269._4_4_ + fStack_f4;
    fStack_f0 = auVar269._8_4_ + fStack_f0;
    fStack_ec = auVar269._12_4_ + fStack_ec;
    fStack_e8 = auVar269._16_4_ + fStack_e8;
    fStack_e4 = auVar269._20_4_ + fStack_e4;
    fStack_e0 = auVar269._24_4_ + fStack_e0;
    fStack_dc = auVar269._28_4_ + auVar254._28_4_;
    local_118 = auVar290._0_4_ + local_118;
    fStack_114 = auVar290._4_4_ + fStack_114;
    fStack_110 = auVar290._8_4_ + fStack_110;
    fStack_10c = auVar290._12_4_ + fStack_10c;
    fStack_108 = auVar290._16_4_ + (float)local_588._0_4_;
    fStack_104 = auVar290._20_4_ + (float)local_588._4_4_;
    fStack_100 = auVar290._24_4_ + fStack_580;
    fStack_fc = auVar290._28_4_ + fStack_57c;
    auVar33._4_4_ = fStack_114 * fVar130;
    auVar33._0_4_ = local_118 * fVar243;
    auVar33._8_4_ = fStack_110 * fVar159;
    auVar33._12_4_ = fStack_10c * fVar185;
    auVar33._16_4_ = fStack_108 * fVar186;
    auVar33._20_4_ = fStack_104 * fVar188;
    auVar33._24_4_ = fStack_100 * fVar190;
    auVar33._28_4_ = auVar290._28_4_ + fStack_57c;
    auVar34._4_4_ = fStack_f4 * fVar220;
    auVar34._0_4_ = local_f8 * fVar217;
    auVar34._8_4_ = fStack_f0 * fVar222;
    auVar34._12_4_ = fStack_ec * fVar303;
    auVar34._16_4_ = fStack_e8 * fVar158;
    auVar34._20_4_ = fStack_e4 * fVar304;
    auVar34._24_4_ = fStack_e0 * fVar305;
    auVar34._28_4_ = fStack_dc;
    auVar28 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar19._4_4_ * fVar130;
    auVar35._0_4_ = auVar19._0_4_ * fVar243;
    auVar35._8_4_ = auVar19._8_4_ * fVar159;
    auVar35._12_4_ = auVar19._12_4_ * fVar185;
    auVar35._16_4_ = auVar19._16_4_ * fVar186;
    auVar35._20_4_ = auVar19._20_4_ * fVar188;
    auVar35._24_4_ = auVar19._24_4_ * fVar190;
    auVar35._28_4_ = fStack_dc;
    auVar36._4_4_ = fVar220 * auVar18._4_4_;
    auVar36._0_4_ = fVar217 * auVar18._0_4_;
    auVar36._8_4_ = fVar222 * auVar18._8_4_;
    auVar36._12_4_ = fVar303 * auVar18._12_4_;
    auVar36._16_4_ = fVar158 * auVar18._16_4_;
    auVar36._20_4_ = fVar304 * auVar18._20_4_;
    auVar36._24_4_ = fVar305 * auVar18._24_4_;
    auVar36._28_4_ = auVar18._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar181._4_4_ * fVar130;
    auVar37._0_4_ = auVar181._0_4_ * fVar243;
    auVar37._8_4_ = auVar181._8_4_ * fVar159;
    auVar37._12_4_ = auVar181._12_4_ * fVar185;
    auVar37._16_4_ = auVar181._16_4_ * fVar186;
    auVar37._20_4_ = auVar181._20_4_ * fVar188;
    auVar37._24_4_ = auVar181._24_4_ * fVar190;
    auVar37._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    auVar24._4_4_ = auVar100._4_4_ * fVar220;
    auVar24._0_4_ = auVar100._0_4_ * fVar217;
    auVar24._8_4_ = auVar100._8_4_ * fVar222;
    auVar24._12_4_ = auVar100._12_4_ * fVar303;
    auVar24._16_4_ = auVar100._16_4_ * fVar158;
    auVar24._20_4_ = auVar100._20_4_ * fVar304;
    auVar24._24_4_ = auVar100._24_4_ * fVar305;
    auVar24._28_4_ = fVar314 + auVar215._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar22 = vminps_avx(auVar20,auVar21);
    auVar97 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar25,auVar26);
    auVar97 = vmaxps_avx(auVar97,auVar22);
    auVar21 = vminps_avx(auVar27,auVar28);
    auVar22 = vmaxps_avx(auVar27,auVar28);
    auVar23 = vminps_avx(auVar29,auVar24);
    auVar21 = vminps_avx(auVar21,auVar23);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar29,auVar24);
    auVar22 = vmaxps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar97,auVar22);
    auVar97 = vcmpps_avx(auVar21,local_138,2);
    auVar22 = vcmpps_avx(auVar22,local_158,5);
    auVar97 = vandps_avx(auVar22,auVar97);
    auVar22 = local_228 & auVar97;
    uVar68 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(auVar99,local_78);
      auVar20 = vsubps_avx(auVar100,auVar269);
      fVar130 = auVar22._0_4_ + auVar20._0_4_;
      fVar159 = auVar22._4_4_ + auVar20._4_4_;
      fVar185 = auVar22._8_4_ + auVar20._8_4_;
      fVar186 = auVar22._12_4_ + auVar20._12_4_;
      fVar188 = auVar22._16_4_ + auVar20._16_4_;
      fVar190 = auVar22._20_4_ + auVar20._20_4_;
      fVar217 = auVar22._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(local_b8,local_98);
      auVar23 = vsubps_avx(auVar181,auVar290);
      fVar220 = auVar21._0_4_ + auVar23._0_4_;
      fVar222 = auVar21._4_4_ + auVar23._4_4_;
      fVar303 = auVar21._8_4_ + auVar23._8_4_;
      fVar158 = auVar21._12_4_ + auVar23._12_4_;
      fVar304 = auVar21._16_4_ + auVar23._16_4_;
      fVar305 = auVar21._20_4_ + auVar23._20_4_;
      fVar314 = auVar21._24_4_ + auVar23._24_4_;
      fVar243 = auVar23._28_4_;
      auVar38._4_4_ = local_98._4_4_ * fVar159;
      auVar38._0_4_ = local_98._0_4_ * fVar130;
      auVar38._8_4_ = local_98._8_4_ * fVar185;
      auVar38._12_4_ = local_98._12_4_ * fVar186;
      auVar38._16_4_ = local_98._16_4_ * fVar188;
      auVar38._20_4_ = local_98._20_4_ * fVar190;
      auVar38._24_4_ = local_98._24_4_ * fVar217;
      auVar38._28_4_ = local_98._28_4_;
      auVar39._4_4_ = local_78._4_4_ * fVar222;
      auVar39._0_4_ = local_78._0_4_ * fVar220;
      auVar39._8_4_ = local_78._8_4_ * fVar303;
      auVar39._12_4_ = local_78._12_4_ * fVar158;
      auVar39._16_4_ = local_78._16_4_ * fVar304;
      auVar39._20_4_ = local_78._20_4_ * fVar305;
      auVar39._24_4_ = local_78._24_4_ * fVar314;
      auVar39._28_4_ = local_78._28_4_;
      auVar23 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar219 * fVar159;
      auVar40._0_4_ = fVar322 * fVar130;
      auVar40._8_4_ = fVar323 * fVar185;
      auVar40._12_4_ = fVar224 * fVar186;
      auVar40._16_4_ = fVar324 * fVar188;
      auVar40._20_4_ = fVar325 * fVar190;
      auVar40._24_4_ = fVar326 * fVar217;
      auVar40._28_4_ = local_98._28_4_;
      auVar41._4_4_ = fVar222 * fStack_d4;
      auVar41._0_4_ = fVar220 * local_d8;
      auVar41._8_4_ = fVar303 * fStack_d0;
      auVar41._12_4_ = fVar158 * fStack_cc;
      auVar41._16_4_ = fVar304 * fStack_c8;
      auVar41._20_4_ = fVar305 * fStack_c4;
      auVar41._24_4_ = fVar314 * fStack_c0;
      auVar41._28_4_ = fVar243;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar159 * auVar98._4_4_;
      auVar42._0_4_ = fVar130 * auVar98._0_4_;
      auVar42._8_4_ = fVar185 * auVar98._8_4_;
      auVar42._12_4_ = fVar186 * auVar98._12_4_;
      auVar42._16_4_ = fVar188 * auVar98._16_4_;
      auVar42._20_4_ = fVar190 * auVar98._20_4_;
      auVar42._24_4_ = fVar217 * auVar98._24_4_;
      auVar42._28_4_ = fVar243;
      auVar43._4_4_ = fVar222 * fStack_544;
      auVar43._0_4_ = fVar220 * local_548;
      auVar43._8_4_ = fVar303 * fStack_540;
      auVar43._12_4_ = fVar158 * fStack_53c;
      auVar43._16_4_ = fVar304 * fStack_538;
      auVar43._20_4_ = fVar305 * fStack_534;
      auVar43._24_4_ = fVar314 * fStack_530;
      auVar43._28_4_ = local_98._28_4_ + auVar214._28_4_;
      auVar98 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_b8._4_4_ * fVar159;
      auVar44._0_4_ = local_b8._0_4_ * fVar130;
      auVar44._8_4_ = local_b8._8_4_ * fVar185;
      auVar44._12_4_ = local_b8._12_4_ * fVar186;
      auVar44._16_4_ = local_b8._16_4_ * fVar188;
      auVar44._20_4_ = local_b8._20_4_ * fVar190;
      auVar44._24_4_ = local_b8._24_4_ * fVar217;
      auVar44._28_4_ = local_98._28_4_ + auVar214._28_4_;
      auVar45._4_4_ = auVar99._4_4_ * fVar222;
      auVar45._0_4_ = auVar99._0_4_ * fVar220;
      auVar45._8_4_ = auVar99._8_4_ * fVar303;
      auVar45._12_4_ = auVar99._12_4_ * fVar158;
      auVar45._16_4_ = auVar99._16_4_ * fVar304;
      auVar45._20_4_ = auVar99._20_4_ * fVar305;
      uVar6 = auVar99._28_4_;
      auVar45._24_4_ = auVar99._24_4_ * fVar314;
      auVar45._28_4_ = uVar6;
      auVar99 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar290._4_4_ * fVar159;
      auVar46._0_4_ = auVar290._0_4_ * fVar130;
      auVar46._8_4_ = auVar290._8_4_ * fVar185;
      auVar46._12_4_ = auVar290._12_4_ * fVar186;
      auVar46._16_4_ = auVar290._16_4_ * fVar188;
      auVar46._20_4_ = auVar290._20_4_ * fVar190;
      auVar46._24_4_ = auVar290._24_4_ * fVar217;
      auVar46._28_4_ = auVar290._28_4_;
      auVar47._4_4_ = auVar269._4_4_ * fVar222;
      auVar47._0_4_ = auVar269._0_4_ * fVar220;
      auVar47._8_4_ = auVar269._8_4_ * fVar303;
      auVar47._12_4_ = auVar269._12_4_ * fVar158;
      auVar47._16_4_ = auVar269._16_4_ * fVar304;
      auVar47._20_4_ = auVar269._20_4_ * fVar305;
      auVar47._24_4_ = auVar269._24_4_ * fVar314;
      auVar47._28_4_ = auVar269._28_4_;
      auVar215 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar159 * fStack_114;
      auVar48._0_4_ = fVar130 * local_118;
      auVar48._8_4_ = fVar185 * fStack_110;
      auVar48._12_4_ = fVar186 * fStack_10c;
      auVar48._16_4_ = fVar188 * fStack_108;
      auVar48._20_4_ = fVar190 * fStack_104;
      auVar48._24_4_ = fVar217 * fStack_100;
      auVar48._28_4_ = auVar290._28_4_;
      auVar49._4_4_ = fVar222 * fStack_f4;
      auVar49._0_4_ = fVar220 * local_f8;
      auVar49._8_4_ = fVar303 * fStack_f0;
      auVar49._12_4_ = fVar158 * fStack_ec;
      auVar49._16_4_ = fVar304 * fStack_e8;
      auVar49._20_4_ = fVar305 * fStack_e4;
      auVar49._24_4_ = fVar314 * fStack_e0;
      auVar49._28_4_ = uVar6;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar159 * auVar19._4_4_;
      auVar50._0_4_ = fVar130 * auVar19._0_4_;
      auVar50._8_4_ = fVar185 * auVar19._8_4_;
      auVar50._12_4_ = fVar186 * auVar19._12_4_;
      auVar50._16_4_ = fVar188 * auVar19._16_4_;
      auVar50._20_4_ = fVar190 * auVar19._20_4_;
      auVar50._24_4_ = fVar217 * auVar19._24_4_;
      auVar50._28_4_ = uVar6;
      auVar51._4_4_ = fVar222 * auVar18._4_4_;
      auVar51._0_4_ = fVar220 * auVar18._0_4_;
      auVar51._8_4_ = fVar303 * auVar18._8_4_;
      auVar51._12_4_ = fVar158 * auVar18._12_4_;
      auVar51._16_4_ = fVar304 * auVar18._16_4_;
      auVar51._20_4_ = fVar305 * auVar18._20_4_;
      auVar51._24_4_ = fVar314 * auVar18._24_4_;
      auVar51._28_4_ = local_b8._28_4_;
      auVar18 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar181._4_4_ * fVar159;
      auVar52._0_4_ = auVar181._0_4_ * fVar130;
      auVar52._8_4_ = auVar181._8_4_ * fVar185;
      auVar52._12_4_ = auVar181._12_4_ * fVar186;
      auVar52._16_4_ = auVar181._16_4_ * fVar188;
      auVar52._20_4_ = auVar181._20_4_ * fVar190;
      auVar52._24_4_ = auVar181._24_4_ * fVar217;
      auVar52._28_4_ = auVar22._28_4_ + auVar20._28_4_;
      auVar53._4_4_ = auVar100._4_4_ * fVar222;
      auVar53._0_4_ = auVar100._0_4_ * fVar220;
      auVar53._8_4_ = auVar100._8_4_ * fVar303;
      auVar53._12_4_ = auVar100._12_4_ * fVar158;
      auVar53._16_4_ = auVar100._16_4_ * fVar304;
      auVar53._20_4_ = auVar100._20_4_ * fVar305;
      auVar53._24_4_ = auVar100._24_4_ * fVar314;
      auVar53._28_4_ = auVar21._28_4_ + fVar243;
      auVar100 = vsubps_avx(auVar52,auVar53);
      auVar20 = vminps_avx(auVar23,auVar24);
      auVar22 = vmaxps_avx(auVar23,auVar24);
      auVar21 = vminps_avx(auVar98,auVar99);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar98,auVar99);
      auVar22 = vmaxps_avx(auVar22,auVar20);
      auVar23 = vminps_avx(auVar215,auVar25);
      auVar20 = vmaxps_avx(auVar215,auVar25);
      auVar98 = vminps_avx(auVar18,auVar100);
      auVar23 = vminps_avx(auVar23,auVar98);
      auVar23 = vminps_avx(auVar21,auVar23);
      auVar21 = vmaxps_avx(auVar18,auVar100);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar22,auVar20);
      auVar22 = vcmpps_avx(auVar23,local_138,2);
      auVar20 = vcmpps_avx(auVar20,local_158,5);
      auVar22 = vandps_avx(auVar20,auVar22);
      auVar97 = vandps_avx(auVar97,local_228);
      auVar20 = auVar97 & auVar22;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar22,auVar97);
        uVar68 = vmovmskps_avx(auVar97);
      }
    }
    if (uVar68 != 0) {
      auStack_398[uVar70] = uVar68;
      uVar7 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar70 * 2) = uVar7;
      uVar74 = vmovlps_avx(_local_5b8);
      auStack_58[uVar70] = uVar74;
      uVar70 = (ulong)((int)uVar70 + 1);
    }
    auVar368 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar70 == 0) {
        if (bVar66) {
          return local_5f9;
        }
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar96._4_4_ = uVar6;
        auVar96._0_4_ = uVar6;
        auVar96._8_4_ = uVar6;
        auVar96._12_4_ = uVar6;
        auVar118 = vcmpps_avx(local_2f8,auVar96,2);
        uVar68 = vmovmskps_avx(auVar118);
        uVar67 = uVar67 & uVar67 + 0xf & uVar68;
        local_5f9 = uVar67 != 0;
        if (!local_5f9) {
          return local_5f9;
        }
        goto LAB_0102eff1;
      }
      uVar72 = (int)uVar70 - 1;
      uVar73 = (ulong)uVar72;
      uVar68 = auStack_398[uVar73];
      fVar243 = afStack_208[uVar73 * 2];
      fVar130 = afStack_208[uVar73 * 2 + 1];
      register0x00001588 = 0;
      local_5b8 = (undefined1  [8])auStack_58[uVar73];
      uVar74 = 0;
      if (uVar68 != 0) {
        for (; (uVar68 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
        }
      }
      uVar68 = uVar68 - 1 & uVar68;
      auStack_398[uVar73] = uVar68;
      if (uVar68 == 0) {
        uVar70 = (ulong)uVar72;
      }
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = &DAT_3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      fVar185 = (float)(uVar74 + 1) * 0.14285715;
      fVar159 = (1.0 - (float)uVar74 * 0.14285715) * fVar243 + fVar130 * (float)uVar74 * 0.14285715;
      fVar243 = (1.0 - fVar185) * fVar243 + fVar130 * fVar185;
      fVar130 = fVar243 - fVar159;
      if (0.16666667 <= fVar130) break;
      auVar118 = vshufps_avx(_local_5b8,_local_5b8,0x50);
      auVar196 = vsubps_avx(auVar231,auVar118);
      fVar185 = auVar118._0_4_;
      fVar186 = auVar118._4_4_;
      fVar188 = auVar118._8_4_;
      fVar190 = auVar118._12_4_;
      fVar217 = auVar196._0_4_;
      fVar220 = auVar196._4_4_;
      fVar222 = auVar196._8_4_;
      fVar303 = auVar196._12_4_;
      auVar170._0_4_ = auVar280._0_4_ * fVar185 + fVar217 * (float)local_4d8._0_4_;
      auVar170._4_4_ = auVar280._4_4_ * fVar186 + fVar220 * (float)local_4d8._4_4_;
      auVar170._8_4_ = auVar280._0_4_ * fVar188 + fVar222 * (float)local_4d8._0_4_;
      auVar170._12_4_ = auVar280._4_4_ * fVar190 + fVar303 * (float)local_4d8._4_4_;
      auVar207._0_4_ = auVar293._0_4_ * fVar185 + fVar217 * (float)local_3a8._0_4_;
      auVar207._4_4_ = auVar293._4_4_ * fVar186 + fVar220 * (float)local_3a8._4_4_;
      auVar207._8_4_ = auVar293._0_4_ * fVar188 + fVar222 * fStack_3a0;
      auVar207._12_4_ = auVar293._4_4_ * fVar190 + fVar303 * fStack_39c;
      auVar232._0_4_ = auVar308._0_4_ * fVar185 + fVar217 * auVar334._0_4_;
      auVar232._4_4_ = auVar308._4_4_ * fVar186 + fVar220 * auVar334._4_4_;
      auVar232._8_4_ = auVar308._0_4_ * fVar188 + fVar222 * auVar334._0_4_;
      auVar232._12_4_ = auVar308._4_4_ * fVar190 + fVar303 * auVar334._4_4_;
      auVar114._0_4_ = auVar92._0_4_ * fVar185 + auVar112._0_4_ * fVar217;
      auVar114._4_4_ = auVar92._4_4_ * fVar186 + auVar112._4_4_ * fVar220;
      auVar114._8_4_ = auVar92._0_4_ * fVar188 + auVar112._0_4_ * fVar222;
      auVar114._12_4_ = auVar92._4_4_ * fVar190 + auVar112._4_4_ * fVar303;
      auVar153._16_16_ = auVar170;
      auVar153._0_16_ = auVar170;
      auVar182._16_16_ = auVar207;
      auVar182._0_16_ = auVar207;
      auVar216._16_16_ = auVar232;
      auVar216._0_16_ = auVar232;
      auVar97 = vshufps_avx(ZEXT2032(CONCAT416(fVar243,ZEXT416((uint)fVar159))),
                            ZEXT2032(CONCAT416(fVar243,ZEXT416((uint)fVar159))),0);
      auVar22 = vsubps_avx(auVar182,auVar153);
      fVar185 = auVar97._0_4_;
      fVar186 = auVar97._4_4_;
      fVar188 = auVar97._8_4_;
      fVar190 = auVar97._12_4_;
      fVar217 = auVar97._16_4_;
      fVar220 = auVar97._20_4_;
      fVar222 = auVar97._24_4_;
      auVar154._0_4_ = auVar170._0_4_ + auVar22._0_4_ * fVar185;
      auVar154._4_4_ = auVar170._4_4_ + auVar22._4_4_ * fVar186;
      auVar154._8_4_ = auVar170._8_4_ + auVar22._8_4_ * fVar188;
      auVar154._12_4_ = auVar170._12_4_ + auVar22._12_4_ * fVar190;
      auVar154._16_4_ = auVar170._0_4_ + auVar22._16_4_ * fVar217;
      auVar154._20_4_ = auVar170._4_4_ + auVar22._20_4_ * fVar220;
      auVar154._24_4_ = auVar170._8_4_ + auVar22._24_4_ * fVar222;
      auVar154._28_4_ = auVar170._12_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar216,auVar182);
      auVar183._0_4_ = auVar207._0_4_ + auVar22._0_4_ * fVar185;
      auVar183._4_4_ = auVar207._4_4_ + auVar22._4_4_ * fVar186;
      auVar183._8_4_ = auVar207._8_4_ + auVar22._8_4_ * fVar188;
      auVar183._12_4_ = auVar207._12_4_ + auVar22._12_4_ * fVar190;
      auVar183._16_4_ = auVar207._0_4_ + auVar22._16_4_ * fVar217;
      auVar183._20_4_ = auVar207._4_4_ + auVar22._20_4_ * fVar220;
      auVar183._24_4_ = auVar207._8_4_ + auVar22._24_4_ * fVar222;
      auVar183._28_4_ = auVar207._12_4_ + auVar22._28_4_;
      auVar118 = vsubps_avx(auVar114,auVar232);
      auVar127._0_4_ = auVar232._0_4_ + auVar118._0_4_ * fVar185;
      auVar127._4_4_ = auVar232._4_4_ + auVar118._4_4_ * fVar186;
      auVar127._8_4_ = auVar232._8_4_ + auVar118._8_4_ * fVar188;
      auVar127._12_4_ = auVar232._12_4_ + auVar118._12_4_ * fVar190;
      auVar127._16_4_ = auVar232._0_4_ + auVar118._0_4_ * fVar217;
      auVar127._20_4_ = auVar232._4_4_ + auVar118._4_4_ * fVar220;
      auVar127._24_4_ = auVar232._8_4_ + auVar118._8_4_ * fVar222;
      auVar127._28_4_ = auVar232._12_4_ + auVar118._12_4_;
      auVar22 = vsubps_avx(auVar183,auVar154);
      auVar155._0_4_ = auVar154._0_4_ + fVar185 * auVar22._0_4_;
      auVar155._4_4_ = auVar154._4_4_ + fVar186 * auVar22._4_4_;
      auVar155._8_4_ = auVar154._8_4_ + fVar188 * auVar22._8_4_;
      auVar155._12_4_ = auVar154._12_4_ + fVar190 * auVar22._12_4_;
      auVar155._16_4_ = auVar154._16_4_ + fVar217 * auVar22._16_4_;
      auVar155._20_4_ = auVar154._20_4_ + fVar220 * auVar22._20_4_;
      auVar155._24_4_ = auVar154._24_4_ + fVar222 * auVar22._24_4_;
      auVar155._28_4_ = auVar154._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar127,auVar183);
      auVar128._0_4_ = auVar183._0_4_ + fVar185 * auVar22._0_4_;
      auVar128._4_4_ = auVar183._4_4_ + fVar186 * auVar22._4_4_;
      auVar128._8_4_ = auVar183._8_4_ + fVar188 * auVar22._8_4_;
      auVar128._12_4_ = auVar183._12_4_ + fVar190 * auVar22._12_4_;
      auVar128._16_4_ = auVar183._16_4_ + fVar217 * auVar22._16_4_;
      auVar128._20_4_ = auVar183._20_4_ + fVar220 * auVar22._20_4_;
      auVar128._24_4_ = auVar183._24_4_ + fVar222 * auVar22._24_4_;
      auVar128._28_4_ = auVar183._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar128,auVar155);
      auVar171._0_4_ = auVar155._0_4_ + fVar185 * auVar22._0_4_;
      auVar171._4_4_ = auVar155._4_4_ + fVar186 * auVar22._4_4_;
      auVar171._8_4_ = auVar155._8_4_ + fVar188 * auVar22._8_4_;
      auVar171._12_4_ = auVar155._12_4_ + fVar190 * auVar22._12_4_;
      auVar184._16_4_ = auVar155._16_4_ + fVar217 * auVar22._16_4_;
      auVar184._0_16_ = auVar171;
      auVar184._20_4_ = auVar155._20_4_ + fVar220 * auVar22._20_4_;
      auVar184._24_4_ = auVar155._24_4_ + fVar222 * auVar22._24_4_;
      auVar184._28_4_ = auVar155._28_4_ + auVar183._28_4_;
      fVar185 = auVar22._4_4_ * 3.0;
      auVar145 = auVar184._16_16_;
      auVar117 = vshufps_avx(ZEXT416((uint)(fVar130 * 0.33333334)),
                             ZEXT416((uint)(fVar130 * 0.33333334)),0);
      auVar294._0_4_ = auVar171._0_4_ + auVar117._0_4_ * auVar22._0_4_ * 3.0;
      auVar294._4_4_ = auVar171._4_4_ + auVar117._4_4_ * fVar185;
      auVar294._8_4_ = auVar171._8_4_ + auVar117._8_4_ * auVar22._8_4_ * 3.0;
      auVar294._12_4_ = auVar171._12_4_ + auVar117._12_4_ * auVar22._12_4_ * 3.0;
      auVar168 = vshufpd_avx(auVar171,auVar171,3);
      auVar177 = vshufpd_avx(auVar145,auVar145,3);
      auVar118 = vsubps_avx(auVar168,auVar171);
      auVar196 = vsubps_avx(auVar177,auVar145);
      auVar115._0_4_ = auVar118._0_4_ + auVar196._0_4_;
      auVar115._4_4_ = auVar118._4_4_ + auVar196._4_4_;
      auVar115._8_4_ = auVar118._8_4_ + auVar196._8_4_;
      auVar115._12_4_ = auVar118._12_4_ + auVar196._12_4_;
      auVar118 = vmovshdup_avx(auVar171);
      auVar196 = vmovshdup_avx(auVar294);
      auVar176 = vshufps_avx(auVar115,auVar115,0);
      auVar94 = vshufps_avx(auVar115,auVar115,0x55);
      fVar220 = auVar94._0_4_;
      fVar222 = auVar94._4_4_;
      fVar303 = auVar94._8_4_;
      fVar158 = auVar94._12_4_;
      fVar186 = auVar176._0_4_;
      fVar188 = auVar176._4_4_;
      fVar190 = auVar176._8_4_;
      fVar217 = auVar176._12_4_;
      auVar281._0_4_ = fVar186 * auVar171._0_4_ + fVar220 * auVar118._0_4_;
      auVar281._4_4_ = fVar188 * auVar171._4_4_ + fVar222 * auVar118._4_4_;
      auVar281._8_4_ = fVar190 * auVar171._8_4_ + fVar303 * auVar118._8_4_;
      auVar281._12_4_ = fVar217 * auVar171._12_4_ + fVar158 * auVar118._12_4_;
      auVar295._0_4_ = auVar294._0_4_ * fVar186 + fVar220 * auVar196._0_4_;
      auVar295._4_4_ = auVar294._4_4_ * fVar188 + fVar222 * auVar196._4_4_;
      auVar295._8_4_ = auVar294._8_4_ * fVar190 + fVar303 * auVar196._8_4_;
      auVar295._12_4_ = auVar294._12_4_ * fVar217 + fVar158 * auVar196._12_4_;
      auVar196 = vshufps_avx(auVar281,auVar281,0xe8);
      auVar176 = vshufps_avx(auVar295,auVar295,0xe8);
      auVar118 = vcmpps_avx(auVar196,auVar176,1);
      uVar68 = vextractps_avx(auVar118,0);
      auVar94 = auVar295;
      if ((uVar68 & 1) == 0) {
        auVar94 = auVar281;
      }
      auVar116._0_4_ = auVar117._0_4_ * auVar22._16_4_ * 3.0;
      auVar116._4_4_ = auVar117._4_4_ * fVar185;
      auVar116._8_4_ = auVar117._8_4_ * auVar22._24_4_ * 3.0;
      auVar116._12_4_ = auVar117._12_4_ * auVar97._28_4_;
      auVar78 = vsubps_avx(auVar145,auVar116);
      auVar117 = vmovshdup_avx(auVar78);
      auVar145 = vmovshdup_avx(auVar145);
      fVar185 = auVar78._0_4_;
      fVar304 = auVar78._4_4_;
      auVar365._0_4_ = fVar186 * fVar185 + fVar220 * auVar117._0_4_;
      auVar365._4_4_ = fVar188 * fVar304 + fVar222 * auVar117._4_4_;
      auVar365._8_4_ = fVar190 * auVar78._8_4_ + fVar303 * auVar117._8_4_;
      auVar365._12_4_ = fVar217 * auVar78._12_4_ + fVar158 * auVar117._12_4_;
      auVar351._0_4_ = fVar186 * auVar184._16_4_ + fVar220 * auVar145._0_4_;
      auVar351._4_4_ = fVar188 * auVar184._20_4_ + fVar222 * auVar145._4_4_;
      auVar351._8_4_ = fVar190 * auVar184._24_4_ + fVar303 * auVar145._8_4_;
      auVar351._12_4_ = fVar217 * auVar184._28_4_ + fVar158 * auVar145._12_4_;
      auVar145 = vshufps_avx(auVar365,auVar365,0xe8);
      auVar17 = vshufps_avx(auVar351,auVar351,0xe8);
      auVar117 = vcmpps_avx(auVar145,auVar17,1);
      uVar68 = vextractps_avx(auVar117,0);
      auVar79 = auVar351;
      if ((uVar68 & 1) == 0) {
        auVar79 = auVar365;
      }
      auVar94 = vmaxss_avx(auVar79,auVar94);
      auVar196 = vminps_avx(auVar196,auVar176);
      auVar176 = vminps_avx(auVar145,auVar17);
      auVar176 = vminps_avx(auVar196,auVar176);
      auVar118 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vblendps_avx(auVar118,auVar117,2);
      auVar117 = vpslld_avx(auVar118,0x1f);
      auVar118 = vshufpd_avx(auVar295,auVar295,1);
      auVar118 = vinsertps_avx(auVar118,auVar351,0x9c);
      auVar196 = vshufpd_avx(auVar281,auVar281,1);
      auVar196 = vinsertps_avx(auVar196,auVar365,0x9c);
      auVar118 = vblendvps_avx(auVar196,auVar118,auVar117);
      auVar196 = vmovshdup_avx(auVar118);
      auVar118 = vmaxss_avx(auVar196,auVar118);
      fVar190 = auVar176._0_4_;
      auVar196 = vmovshdup_avx(auVar176);
      fVar188 = auVar118._0_4_;
      fVar217 = auVar196._0_4_;
      fVar186 = auVar94._0_4_;
      if ((0.0001 <= fVar190) || (fVar188 <= -0.0001)) {
        if ((-0.0001 < fVar186 && fVar217 < 0.0001) ||
           ((fVar190 < 0.0001 && -0.0001 < fVar186 || (fVar217 < 0.0001 && -0.0001 < fVar188))))
        goto LAB_0103071c;
LAB_01031353:
        bVar54 = true;
        auVar368 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0103071c:
        auVar368 = ZEXT464(0) << 0x20;
        auVar117 = vcmpps_avx(auVar176,ZEXT416(0) << 0x20,1);
        auVar196 = vcmpss_avx(auVar94,ZEXT416(0),1);
        auVar358._8_4_ = 0x3f800000;
        auVar358._0_8_ = &DAT_3f8000003f800000;
        auVar358._12_4_ = 0x3f800000;
        auVar233._8_4_ = 0xbf800000;
        auVar233._0_8_ = 0xbf800000bf800000;
        auVar233._12_4_ = 0xbf800000;
        auVar196 = vblendvps_avx(auVar358,auVar233,auVar196);
        auVar117 = vblendvps_avx(auVar358,auVar233,auVar117);
        auVar145 = vcmpss_avx(auVar196,auVar117,4);
        auVar145 = vpshufd_avx(ZEXT416(auVar145._0_4_ & 1),0x50);
        auVar145 = vpslld_avx(auVar145,0x1f);
        auVar145 = vpsrad_avx(auVar145,0x1f);
        auVar145 = vpandn_avx(auVar145,_DAT_02020eb0);
        auVar17 = vmovshdup_avx(auVar117);
        fVar220 = auVar17._0_4_;
        if ((auVar117._0_4_ != fVar220) || (NAN(auVar117._0_4_) || NAN(fVar220))) {
          if ((fVar217 != fVar190) || (NAN(fVar217) || NAN(fVar190))) {
            fVar190 = -fVar190 / (fVar217 - fVar190);
            auVar117 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar190) * 0.0 + fVar190)));
          }
          else {
            auVar117 = vcmpss_avx(auVar176,ZEXT416(0),0);
            auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
            auVar117 = vpslld_avx(auVar117,0x1f);
            auVar117 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar117);
          }
          auVar17 = vcmpps_avx(auVar145,auVar117,1);
          auVar176 = vblendps_avx(auVar145,auVar117,2);
          auVar117 = vblendps_avx(auVar117,auVar145,2);
          auVar145 = vblendvps_avx(auVar117,auVar176,auVar17);
        }
        auVar118 = vcmpss_avx(auVar118,ZEXT416(0),1);
        auVar146._8_4_ = 0xbf800000;
        auVar146._0_8_ = 0xbf800000bf800000;
        auVar146._12_4_ = 0xbf800000;
        auVar118 = vblendvps_avx(auVar358,auVar146,auVar118);
        fVar190 = auVar118._0_4_;
        if ((auVar196._0_4_ != fVar190) || (NAN(auVar196._0_4_) || NAN(fVar190))) {
          if ((fVar188 != fVar186) || (NAN(fVar188) || NAN(fVar186))) {
            fVar186 = -fVar186 / (fVar188 - fVar186);
            auVar118 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar186) * 0.0 + fVar186)));
          }
          else {
            auVar118 = vcmpss_avx(auVar94,ZEXT416(0),0);
            auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
            auVar118 = vpslld_avx(auVar118,0x1f);
            auVar118 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar118);
          }
          auVar117 = vcmpps_avx(auVar145,auVar118,1);
          auVar196 = vblendps_avx(auVar145,auVar118,2);
          auVar118 = vblendps_avx(auVar118,auVar145,2);
          auVar145 = vblendvps_avx(auVar118,auVar196,auVar117);
        }
        if ((fVar220 != fVar190) || (NAN(fVar220) || NAN(fVar190))) {
          auVar118 = vcmpps_avx(auVar145,auVar358,1);
          auVar196 = vinsertps_avx(auVar145,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar234._4_12_ = auVar145._4_12_;
          auVar234._0_4_ = 0x3f800000;
          auVar145 = vblendvps_avx(auVar234,auVar196,auVar118);
        }
        auVar118 = vcmpps_avx(auVar145,_DAT_01fec6f0,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar145._4_12_;
        auVar196 = vinsertps_avx(auVar145,ZEXT416(0x3f800000),0x10);
        auVar118 = vblendvps_avx(auVar196,auVar55 << 0x20,auVar118);
        auVar196 = vmovshdup_avx(auVar118);
        bVar54 = true;
        if (auVar118._0_4_ <= auVar196._0_4_) {
          auVar119._0_4_ = auVar118._0_4_ + -0.1;
          auVar119._4_4_ = auVar118._4_4_ + 0.1;
          auVar119._8_4_ = auVar118._8_4_ + 0.0;
          auVar119._12_4_ = auVar118._12_4_ + 0.0;
          auVar117 = vshufpd_avx(auVar294,auVar294,3);
          auVar172._8_8_ = 0x3f80000000000000;
          auVar172._0_8_ = 0x3f80000000000000;
          auVar118 = vcmpps_avx(auVar119,auVar172,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar119._4_12_;
          auVar196 = vinsertps_avx(auVar119,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar118 = vblendvps_avx(auVar196,auVar56 << 0x20,auVar118);
          auVar196 = vshufpd_avx(auVar78,auVar78,3);
          auVar176 = vshufps_avx(auVar118,auVar118,0x50);
          auVar94 = vsubps_avx(auVar358,auVar176);
          local_458 = auVar168._0_4_;
          fStack_454 = auVar168._4_4_;
          fStack_450 = auVar168._8_4_;
          fStack_44c = auVar168._12_4_;
          fVar186 = auVar176._0_4_;
          fVar188 = auVar176._4_4_;
          fVar190 = auVar176._8_4_;
          fVar217 = auVar176._12_4_;
          local_528 = auVar177._0_4_;
          fStack_524 = auVar177._4_4_;
          fStack_520 = auVar177._8_4_;
          fStack_51c = auVar177._12_4_;
          fVar220 = auVar94._0_4_;
          fVar222 = auVar94._4_4_;
          fVar303 = auVar94._8_4_;
          fVar158 = auVar94._12_4_;
          auVar147._0_4_ = fVar186 * local_458 + fVar220 * auVar171._0_4_;
          auVar147._4_4_ = fVar188 * fStack_454 + fVar222 * auVar171._4_4_;
          auVar147._8_4_ = fVar190 * fStack_450 + fVar303 * auVar171._0_4_;
          auVar147._12_4_ = fVar217 * fStack_44c + fVar158 * auVar171._4_4_;
          auVar208._0_4_ = fVar186 * auVar117._0_4_ + fVar220 * auVar294._0_4_;
          auVar208._4_4_ = fVar188 * auVar117._4_4_ + fVar222 * auVar294._4_4_;
          auVar208._8_4_ = fVar190 * auVar117._8_4_ + fVar303 * auVar294._0_4_;
          auVar208._12_4_ = fVar217 * auVar117._12_4_ + fVar158 * auVar294._4_4_;
          auVar267._0_4_ = fVar186 * auVar196._0_4_ + fVar220 * fVar185;
          auVar267._4_4_ = fVar188 * auVar196._4_4_ + fVar222 * fVar304;
          auVar267._8_4_ = fVar190 * auVar196._8_4_ + fVar303 * fVar185;
          auVar267._12_4_ = fVar217 * auVar196._12_4_ + fVar158 * fVar304;
          auVar282._0_4_ = fVar186 * local_528 + fVar220 * auVar184._16_4_;
          auVar282._4_4_ = fVar188 * fStack_524 + fVar222 * auVar184._20_4_;
          auVar282._8_4_ = fVar190 * fStack_520 + fVar303 * auVar184._16_4_;
          auVar282._12_4_ = fVar217 * fStack_51c + fVar158 * auVar184._20_4_;
          auVar177 = vsubps_avx(auVar358,auVar118);
          auVar196 = vmovshdup_avx(_local_5b8);
          auVar168 = vmovsldup_avx(_local_5b8);
          local_5b8._0_4_ = auVar177._0_4_ * auVar168._0_4_ + auVar196._0_4_ * auVar118._0_4_;
          local_5b8._4_4_ = auVar177._4_4_ * auVar168._4_4_ + auVar196._4_4_ * auVar118._4_4_;
          fStack_5b0 = auVar177._8_4_ * auVar168._8_4_ + auVar196._8_4_ * auVar118._8_4_;
          fStack_5ac = auVar177._12_4_ * auVar168._12_4_ + auVar196._12_4_ * auVar118._12_4_;
          auVar78 = vmovshdup_avx(_local_5b8);
          auVar118 = vsubps_avx(auVar208,auVar147);
          auVar235._0_4_ = auVar118._0_4_ * 3.0;
          auVar235._4_4_ = auVar118._4_4_ * 3.0;
          auVar235._8_4_ = auVar118._8_4_ * 3.0;
          auVar235._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar267,auVar208);
          auVar250._0_4_ = auVar118._0_4_ * 3.0;
          auVar250._4_4_ = auVar118._4_4_ * 3.0;
          auVar250._8_4_ = auVar118._8_4_ * 3.0;
          auVar250._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar282,auVar267);
          auVar296._0_4_ = auVar118._0_4_ * 3.0;
          auVar296._4_4_ = auVar118._4_4_ * 3.0;
          auVar296._8_4_ = auVar118._8_4_ * 3.0;
          auVar296._12_4_ = auVar118._12_4_ * 3.0;
          auVar196 = vminps_avx(auVar250,auVar296);
          auVar118 = vmaxps_avx(auVar250,auVar296);
          auVar196 = vminps_avx(auVar235,auVar196);
          auVar118 = vmaxps_avx(auVar235,auVar118);
          auVar168 = vshufpd_avx(auVar196,auVar196,3);
          auVar177 = vshufpd_avx(auVar118,auVar118,3);
          auVar196 = vminps_avx(auVar196,auVar168);
          auVar118 = vmaxps_avx(auVar118,auVar177);
          auVar168 = vshufps_avx(ZEXT416((uint)(1.0 / fVar130)),ZEXT416((uint)(1.0 / fVar130)),0);
          auVar236._0_4_ = auVar168._0_4_ * auVar196._0_4_;
          auVar236._4_4_ = auVar168._4_4_ * auVar196._4_4_;
          auVar236._8_4_ = auVar168._8_4_ * auVar196._8_4_;
          auVar236._12_4_ = auVar168._12_4_ * auVar196._12_4_;
          auVar251._0_4_ = auVar118._0_4_ * auVar168._0_4_;
          auVar251._4_4_ = auVar118._4_4_ * auVar168._4_4_;
          auVar251._8_4_ = auVar118._8_4_ * auVar168._8_4_;
          auVar251._12_4_ = auVar118._12_4_ * auVar168._12_4_;
          auVar94 = ZEXT416((uint)(1.0 / (auVar78._0_4_ - (float)local_5b8._0_4_)));
          auVar118 = vshufpd_avx(auVar147,auVar147,3);
          auVar196 = vshufpd_avx(auVar208,auVar208,3);
          auVar168 = vshufpd_avx(auVar267,auVar267,3);
          auVar177 = vshufpd_avx(auVar282,auVar282,3);
          auVar118 = vsubps_avx(auVar118,auVar147);
          auVar117 = vsubps_avx(auVar196,auVar208);
          auVar176 = vsubps_avx(auVar168,auVar267);
          auVar177 = vsubps_avx(auVar177,auVar282);
          auVar196 = vminps_avx(auVar118,auVar117);
          auVar118 = vmaxps_avx(auVar118,auVar117);
          auVar168 = vminps_avx(auVar176,auVar177);
          auVar168 = vminps_avx(auVar196,auVar168);
          auVar196 = vmaxps_avx(auVar176,auVar177);
          auVar118 = vmaxps_avx(auVar118,auVar196);
          auVar196 = vshufps_avx(auVar94,auVar94,0);
          auVar309._0_4_ = auVar196._0_4_ * auVar168._0_4_;
          auVar309._4_4_ = auVar196._4_4_ * auVar168._4_4_;
          auVar309._8_4_ = auVar196._8_4_ * auVar168._8_4_;
          auVar309._12_4_ = auVar196._12_4_ * auVar168._12_4_;
          auVar317._0_4_ = auVar196._0_4_ * auVar118._0_4_;
          auVar317._4_4_ = auVar196._4_4_ * auVar118._4_4_;
          auVar317._8_4_ = auVar196._8_4_ * auVar118._8_4_;
          auVar317._12_4_ = auVar196._12_4_ * auVar118._12_4_;
          auVar118 = vmovsldup_avx(_local_5b8);
          auVar268._4_12_ = auVar118._4_12_;
          auVar268._0_4_ = fVar159;
          auVar283._4_12_ = local_5b8._4_12_;
          auVar283._0_4_ = fVar243;
          auVar95._0_4_ = (fVar243 + fVar159) * 0.5;
          auVar95._4_4_ = ((float)local_5b8._4_4_ + auVar118._4_4_) * 0.5;
          auVar95._8_4_ = (fStack_5b0 + auVar118._8_4_) * 0.5;
          auVar95._12_4_ = (fStack_5ac + auVar118._12_4_) * 0.5;
          auVar118 = vshufps_avx(auVar95,auVar95,0);
          fVar185 = auVar118._0_4_;
          fVar186 = auVar118._4_4_;
          fVar188 = auVar118._8_4_;
          fVar190 = auVar118._12_4_;
          local_4e8 = auVar203._0_4_;
          fStack_4e4 = auVar203._4_4_;
          fStack_4e0 = auVar203._8_4_;
          fStack_4dc = auVar203._12_4_;
          auVar209._0_4_ = fVar185 * (float)local_238._0_4_ + local_4e8;
          auVar209._4_4_ = fVar186 * (float)local_238._4_4_ + fStack_4e4;
          auVar209._8_4_ = fVar188 * fStack_230 + fStack_4e0;
          auVar209._12_4_ = fVar190 * fStack_22c + fStack_4dc;
          local_4f8 = auVar15._0_4_;
          fStack_4f4 = auVar15._4_4_;
          fStack_4f0 = auVar15._8_4_;
          fStack_4ec = auVar15._12_4_;
          auVar297._0_4_ = fVar185 * (float)local_248._0_4_ + local_4f8;
          auVar297._4_4_ = fVar186 * (float)local_248._4_4_ + fStack_4f4;
          auVar297._8_4_ = fVar188 * fStack_240 + fStack_4f0;
          auVar297._12_4_ = fVar190 * fStack_23c + fStack_4ec;
          local_508 = auVar16._0_4_;
          fStack_504 = auVar16._4_4_;
          fStack_500 = auVar16._8_4_;
          fStack_4fc = auVar16._12_4_;
          auVar335._0_4_ = fVar185 * (float)local_258._0_4_ + local_508;
          auVar335._4_4_ = fVar186 * (float)local_258._4_4_ + fStack_504;
          auVar335._8_4_ = fVar188 * fStack_250 + fStack_500;
          auVar335._12_4_ = fVar190 * fStack_24c + fStack_4fc;
          auVar118 = vsubps_avx(auVar297,auVar209);
          auVar210._0_4_ = auVar118._0_4_ * fVar185 + auVar209._0_4_;
          auVar210._4_4_ = auVar118._4_4_ * fVar186 + auVar209._4_4_;
          auVar210._8_4_ = auVar118._8_4_ * fVar188 + auVar209._8_4_;
          auVar210._12_4_ = auVar118._12_4_ * fVar190 + auVar209._12_4_;
          auVar118 = vsubps_avx(auVar335,auVar297);
          auVar298._0_4_ = auVar297._0_4_ + auVar118._0_4_ * fVar185;
          auVar298._4_4_ = auVar297._4_4_ + auVar118._4_4_ * fVar186;
          auVar298._8_4_ = auVar297._8_4_ + auVar118._8_4_ * fVar188;
          auVar298._12_4_ = auVar297._12_4_ + auVar118._12_4_ * fVar190;
          auVar118 = vsubps_avx(auVar298,auVar210);
          fVar185 = auVar210._0_4_ + auVar118._0_4_ * fVar185;
          fVar186 = auVar210._4_4_ + auVar118._4_4_ * fVar186;
          auVar148._0_8_ = CONCAT44(fVar186,fVar185);
          auVar148._8_4_ = auVar210._8_4_ + auVar118._8_4_ * fVar188;
          auVar148._12_4_ = auVar210._12_4_ + auVar118._12_4_ * fVar190;
          fVar188 = auVar118._0_4_ * 3.0;
          fVar190 = auVar118._4_4_ * 3.0;
          auVar211._0_8_ = CONCAT44(fVar190,fVar188);
          auVar211._8_4_ = auVar118._8_4_ * 3.0;
          auVar211._12_4_ = auVar118._12_4_ * 3.0;
          auVar299._8_8_ = auVar148._0_8_;
          auVar299._0_8_ = auVar148._0_8_;
          auVar118 = vshufpd_avx(auVar148,auVar148,3);
          auVar196 = vshufps_avx(auVar95,auVar95,0x55);
          auVar176 = vsubps_avx(auVar118,auVar299);
          auVar300._0_4_ = auVar196._0_4_ * auVar176._0_4_ + fVar185;
          auVar300._4_4_ = auVar196._4_4_ * auVar176._4_4_ + fVar186;
          auVar300._8_4_ = auVar196._8_4_ * auVar176._8_4_ + fVar185;
          auVar300._12_4_ = auVar196._12_4_ * auVar176._12_4_ + fVar186;
          auVar352._8_8_ = auVar211._0_8_;
          auVar352._0_8_ = auVar211._0_8_;
          auVar118 = vshufpd_avx(auVar211,auVar211,1);
          auVar118 = vsubps_avx(auVar118,auVar352);
          auVar212._0_4_ = fVar188 + auVar196._0_4_ * auVar118._0_4_;
          auVar212._4_4_ = fVar190 + auVar196._4_4_ * auVar118._4_4_;
          auVar212._8_4_ = fVar188 + auVar196._8_4_ * auVar118._8_4_;
          auVar212._12_4_ = fVar190 + auVar196._12_4_ * auVar118._12_4_;
          auVar196 = vmovshdup_avx(auVar212);
          auVar353._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
          auVar353._8_4_ = auVar196._8_4_ ^ 0x80000000;
          auVar353._12_4_ = auVar196._12_4_ ^ 0x80000000;
          auVar168 = vmovshdup_avx(auVar176);
          auVar118 = vunpcklps_avx(auVar168,auVar353);
          auVar177 = vshufps_avx(auVar118,auVar353,4);
          auVar149._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
          auVar149._8_4_ = -auVar176._8_4_;
          auVar149._12_4_ = -auVar176._12_4_;
          auVar118 = vmovlhps_avx(auVar149,auVar212);
          auVar117 = vshufps_avx(auVar118,auVar212,8);
          auVar118 = ZEXT416((uint)(auVar168._0_4_ * auVar212._0_4_ -
                                   auVar196._0_4_ * auVar176._0_4_));
          auVar196 = vshufps_avx(auVar118,auVar118,0);
          auVar118 = vdivps_avx(auVar177,auVar196);
          auVar196 = vdivps_avx(auVar117,auVar196);
          auVar117 = vinsertps_avx(auVar236,auVar309,0x1c);
          auVar176 = vinsertps_avx(auVar251,auVar317,0x1c);
          auVar94 = vinsertps_avx(auVar309,auVar236,0x4c);
          auVar145 = vinsertps_avx(auVar317,auVar251,0x4c);
          auVar168 = vmovsldup_avx(auVar118);
          auVar318._0_4_ = auVar168._0_4_ * auVar117._0_4_;
          auVar318._4_4_ = auVar168._4_4_ * auVar117._4_4_;
          auVar318._8_4_ = auVar168._8_4_ * auVar117._8_4_;
          auVar318._12_4_ = auVar168._12_4_ * auVar117._12_4_;
          auVar310._0_4_ = auVar168._0_4_ * auVar176._0_4_;
          auVar310._4_4_ = auVar168._4_4_ * auVar176._4_4_;
          auVar310._8_4_ = auVar168._8_4_ * auVar176._8_4_;
          auVar310._12_4_ = auVar168._12_4_ * auVar176._12_4_;
          auVar177 = vminps_avx(auVar318,auVar310);
          auVar168 = vmaxps_avx(auVar310,auVar318);
          auVar17 = vmovsldup_avx(auVar196);
          auVar366._0_4_ = auVar17._0_4_ * auVar94._0_4_;
          auVar366._4_4_ = auVar17._4_4_ * auVar94._4_4_;
          auVar366._8_4_ = auVar17._8_4_ * auVar94._8_4_;
          auVar366._12_4_ = auVar17._12_4_ * auVar94._12_4_;
          auVar311._0_4_ = auVar17._0_4_ * auVar145._0_4_;
          auVar311._4_4_ = auVar17._4_4_ * auVar145._4_4_;
          auVar311._8_4_ = auVar17._8_4_ * auVar145._8_4_;
          auVar311._12_4_ = auVar17._12_4_ * auVar145._12_4_;
          auVar17 = vminps_avx(auVar366,auVar311);
          auVar120._0_4_ = auVar177._0_4_ + auVar17._0_4_;
          auVar120._4_4_ = auVar177._4_4_ + auVar17._4_4_;
          auVar120._8_4_ = auVar177._8_4_ + auVar17._8_4_;
          auVar120._12_4_ = auVar177._12_4_ + auVar17._12_4_;
          auVar177 = vmaxps_avx(auVar311,auVar366);
          auVar17 = vsubps_avx(auVar268,auVar95);
          auVar79 = vsubps_avx(auVar283,auVar95);
          auVar284._0_4_ = auVar168._0_4_ + auVar177._0_4_;
          auVar284._4_4_ = auVar168._4_4_ + auVar177._4_4_;
          auVar284._8_4_ = auVar168._8_4_ + auVar177._8_4_;
          auVar284._12_4_ = auVar168._12_4_ + auVar177._12_4_;
          auVar319._8_8_ = 0x3f800000;
          auVar319._0_8_ = 0x3f800000;
          auVar168 = vsubps_avx(auVar319,auVar284);
          auVar177 = vsubps_avx(auVar319,auVar120);
          fVar222 = auVar17._0_4_;
          auVar320._0_4_ = fVar222 * auVar168._0_4_;
          fVar303 = auVar17._4_4_;
          auVar320._4_4_ = fVar303 * auVar168._4_4_;
          fVar158 = auVar17._8_4_;
          auVar320._8_4_ = fVar158 * auVar168._8_4_;
          fVar304 = auVar17._12_4_;
          auVar320._12_4_ = fVar304 * auVar168._12_4_;
          fVar188 = auVar79._0_4_;
          auVar285._0_4_ = auVar168._0_4_ * fVar188;
          fVar190 = auVar79._4_4_;
          auVar285._4_4_ = auVar168._4_4_ * fVar190;
          fVar217 = auVar79._8_4_;
          auVar285._8_4_ = auVar168._8_4_ * fVar217;
          fVar220 = auVar79._12_4_;
          auVar285._12_4_ = auVar168._12_4_ * fVar220;
          auVar359._0_4_ = fVar222 * auVar177._0_4_;
          auVar359._4_4_ = fVar303 * auVar177._4_4_;
          auVar359._8_4_ = fVar158 * auVar177._8_4_;
          auVar359._12_4_ = fVar304 * auVar177._12_4_;
          auVar121._0_4_ = fVar188 * auVar177._0_4_;
          auVar121._4_4_ = fVar190 * auVar177._4_4_;
          auVar121._8_4_ = fVar217 * auVar177._8_4_;
          auVar121._12_4_ = fVar220 * auVar177._12_4_;
          auVar168 = vminps_avx(auVar320,auVar359);
          auVar177 = vminps_avx(auVar285,auVar121);
          auVar17 = vminps_avx(auVar168,auVar177);
          auVar168 = vmaxps_avx(auVar359,auVar320);
          auVar177 = vmaxps_avx(auVar121,auVar285);
          auVar79 = vshufps_avx(auVar95,auVar95,0x54);
          auVar177 = vmaxps_avx(auVar177,auVar168);
          auVar80 = vshufps_avx(auVar300,auVar300,0);
          auVar104 = vshufps_avx(auVar300,auVar300,0x55);
          auVar168 = vhaddps_avx(auVar17,auVar17);
          auVar177 = vhaddps_avx(auVar177,auVar177);
          auVar286._0_4_ = auVar80._0_4_ * auVar118._0_4_ + auVar104._0_4_ * auVar196._0_4_;
          auVar286._4_4_ = auVar80._4_4_ * auVar118._4_4_ + auVar104._4_4_ * auVar196._4_4_;
          auVar286._8_4_ = auVar80._8_4_ * auVar118._8_4_ + auVar104._8_4_ * auVar196._8_4_;
          auVar286._12_4_ = auVar80._12_4_ * auVar118._12_4_ + auVar104._12_4_ * auVar196._12_4_;
          auVar17 = vsubps_avx(auVar79,auVar286);
          fVar185 = auVar17._0_4_ + auVar168._0_4_;
          fVar186 = auVar17._0_4_ + auVar177._0_4_;
          auVar168 = vmaxss_avx(ZEXT416((uint)fVar159),ZEXT416((uint)fVar185));
          auVar177 = vminss_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar243));
          if (auVar168._0_4_ <= auVar177._0_4_) {
            auVar168 = vmovshdup_avx(auVar118);
            auVar173._0_4_ = auVar117._0_4_ * auVar168._0_4_;
            auVar173._4_4_ = auVar117._4_4_ * auVar168._4_4_;
            auVar173._8_4_ = auVar117._8_4_ * auVar168._8_4_;
            auVar173._12_4_ = auVar117._12_4_ * auVar168._12_4_;
            auVar122._0_4_ = auVar176._0_4_ * auVar168._0_4_;
            auVar122._4_4_ = auVar176._4_4_ * auVar168._4_4_;
            auVar122._8_4_ = auVar176._8_4_ * auVar168._8_4_;
            auVar122._12_4_ = auVar176._12_4_ * auVar168._12_4_;
            auVar177 = vminps_avx(auVar173,auVar122);
            auVar168 = vmaxps_avx(auVar122,auVar173);
            auVar117 = vmovshdup_avx(auVar196);
            auVar237._0_4_ = auVar117._0_4_ * auVar94._0_4_;
            auVar237._4_4_ = auVar117._4_4_ * auVar94._4_4_;
            auVar237._8_4_ = auVar117._8_4_ * auVar94._8_4_;
            auVar237._12_4_ = auVar117._12_4_ * auVar94._12_4_;
            auVar174._0_4_ = auVar117._0_4_ * auVar145._0_4_;
            auVar174._4_4_ = auVar117._4_4_ * auVar145._4_4_;
            auVar174._8_4_ = auVar117._8_4_ * auVar145._8_4_;
            auVar174._12_4_ = auVar117._12_4_ * auVar145._12_4_;
            auVar117 = vminps_avx(auVar237,auVar174);
            auVar252._0_4_ = auVar177._0_4_ + auVar117._0_4_;
            auVar252._4_4_ = auVar177._4_4_ + auVar117._4_4_;
            auVar252._8_4_ = auVar177._8_4_ + auVar117._8_4_;
            auVar252._12_4_ = auVar177._12_4_ + auVar117._12_4_;
            auVar177 = vmaxps_avx(auVar174,auVar237);
            auVar123._0_4_ = auVar168._0_4_ + auVar177._0_4_;
            auVar123._4_4_ = auVar168._4_4_ + auVar177._4_4_;
            auVar123._8_4_ = auVar168._8_4_ + auVar177._8_4_;
            auVar123._12_4_ = auVar168._12_4_ + auVar177._12_4_;
            auVar168 = vsubps_avx(auVar172,auVar123);
            auVar177 = vsubps_avx(auVar172,auVar252);
            auVar238._0_4_ = fVar222 * auVar168._0_4_;
            auVar238._4_4_ = fVar303 * auVar168._4_4_;
            auVar238._8_4_ = fVar158 * auVar168._8_4_;
            auVar238._12_4_ = fVar304 * auVar168._12_4_;
            auVar253._0_4_ = fVar222 * auVar177._0_4_;
            auVar253._4_4_ = fVar303 * auVar177._4_4_;
            auVar253._8_4_ = fVar158 * auVar177._8_4_;
            auVar253._12_4_ = fVar304 * auVar177._12_4_;
            auVar124._0_4_ = fVar188 * auVar168._0_4_;
            auVar124._4_4_ = fVar190 * auVar168._4_4_;
            auVar124._8_4_ = fVar217 * auVar168._8_4_;
            auVar124._12_4_ = fVar220 * auVar168._12_4_;
            auVar175._0_4_ = fVar188 * auVar177._0_4_;
            auVar175._4_4_ = fVar190 * auVar177._4_4_;
            auVar175._8_4_ = fVar217 * auVar177._8_4_;
            auVar175._12_4_ = fVar220 * auVar177._12_4_;
            auVar168 = vminps_avx(auVar238,auVar253);
            auVar177 = vminps_avx(auVar124,auVar175);
            auVar168 = vminps_avx(auVar168,auVar177);
            auVar177 = vmaxps_avx(auVar253,auVar238);
            auVar117 = vmaxps_avx(auVar175,auVar124);
            auVar168 = vhaddps_avx(auVar168,auVar168);
            auVar177 = vmaxps_avx(auVar117,auVar177);
            auVar177 = vhaddps_avx(auVar177,auVar177);
            auVar117 = vmovshdup_avx(auVar17);
            auVar176 = ZEXT416((uint)(auVar117._0_4_ + auVar168._0_4_));
            auVar168 = vmaxss_avx(_local_5b8,auVar176);
            auVar117 = ZEXT416((uint)(auVar117._0_4_ + auVar177._0_4_));
            auVar177 = vminss_avx(auVar117,auVar78);
            auVar360._8_4_ = 0x7fffffff;
            auVar360._0_8_ = 0x7fffffff7fffffff;
            auVar360._12_4_ = 0x7fffffff;
            if (auVar168._0_4_ <= auVar177._0_4_) {
              uVar68 = 0;
              auVar368 = ZEXT864(0) << 0x20;
              if ((fVar159 < fVar185) && (fVar186 < fVar243)) {
                auVar168 = vcmpps_avx(auVar117,auVar78,1);
                auVar177 = vcmpps_avx(_local_5b8,auVar176,1);
                auVar168 = vandps_avx(auVar177,auVar168);
                uVar68 = auVar168._0_4_;
              }
              if (((uint)uVar70 < 4 && 0.001 <= fVar130) && (uVar68 & 1) == 0) {
                bVar54 = false;
              }
              else {
                lVar71 = 200;
                do {
                  fVar185 = auVar17._0_4_;
                  fVar130 = 1.0 - fVar185;
                  auVar168 = ZEXT416((uint)(fVar130 * fVar130 * fVar130));
                  auVar168 = vshufps_avx(auVar168,auVar168,0);
                  auVar177 = ZEXT416((uint)(fVar185 * 3.0 * fVar130 * fVar130));
                  auVar177 = vshufps_avx(auVar177,auVar177,0);
                  auVar117 = ZEXT416((uint)(fVar130 * fVar185 * fVar185 * 3.0));
                  auVar117 = vshufps_avx(auVar117,auVar117,0);
                  auVar176 = ZEXT416((uint)(fVar185 * fVar185 * fVar185));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  fVar130 = local_4e8 * auVar168._0_4_ +
                            local_4f8 * auVar177._0_4_ +
                            (float)local_3b8._0_4_ * auVar176._0_4_ + local_508 * auVar117._0_4_;
                  fVar185 = fStack_4e4 * auVar168._4_4_ +
                            fStack_4f4 * auVar177._4_4_ +
                            (float)local_3b8._4_4_ * auVar176._4_4_ + fStack_504 * auVar117._4_4_;
                  auVar125._0_8_ = CONCAT44(fVar185,fVar130);
                  auVar125._8_4_ =
                       fStack_4e0 * auVar168._8_4_ +
                       fStack_4f0 * auVar177._8_4_ +
                       fStack_3b0 * auVar176._8_4_ + fStack_500 * auVar117._8_4_;
                  auVar125._12_4_ =
                       fStack_4dc * auVar168._12_4_ +
                       fStack_4ec * auVar177._12_4_ +
                       fStack_3ac * auVar176._12_4_ + fStack_4fc * auVar117._12_4_;
                  auVar178._8_8_ = auVar125._0_8_;
                  auVar178._0_8_ = auVar125._0_8_;
                  auVar177 = vshufpd_avx(auVar125,auVar125,1);
                  auVar168 = vmovshdup_avx(auVar17);
                  auVar177 = vsubps_avx(auVar177,auVar178);
                  auVar126._0_4_ = auVar168._0_4_ * auVar177._0_4_ + fVar130;
                  auVar126._4_4_ = auVar168._4_4_ * auVar177._4_4_ + fVar185;
                  auVar126._8_4_ = auVar168._8_4_ * auVar177._8_4_ + fVar130;
                  auVar126._12_4_ = auVar168._12_4_ * auVar177._12_4_ + fVar185;
                  auVar168 = vshufps_avx(auVar126,auVar126,0);
                  auVar177 = vshufps_avx(auVar126,auVar126,0x55);
                  auVar179._0_4_ = auVar118._0_4_ * auVar168._0_4_ + auVar196._0_4_ * auVar177._0_4_
                  ;
                  auVar179._4_4_ = auVar118._4_4_ * auVar168._4_4_ + auVar196._4_4_ * auVar177._4_4_
                  ;
                  auVar179._8_4_ = auVar118._8_4_ * auVar168._8_4_ + auVar196._8_4_ * auVar177._8_4_
                  ;
                  auVar179._12_4_ =
                       auVar118._12_4_ * auVar168._12_4_ + auVar196._12_4_ * auVar177._12_4_;
                  auVar17 = vsubps_avx(auVar17,auVar179);
                  auVar168 = vandps_avx(auVar360,auVar126);
                  auVar177 = vshufps_avx(auVar168,auVar168,0xf5);
                  auVar168 = vmaxss_avx(auVar177,auVar168);
                  if (auVar168._0_4_ < fVar129) {
                    fVar130 = auVar17._0_4_;
                    if ((0.0 <= fVar130) && (fVar130 <= 1.0)) {
                      auVar118 = vmovshdup_avx(auVar17);
                      fVar185 = auVar118._0_4_;
                      if ((0.0 <= fVar185) && (fVar185 <= 1.0)) {
                        auVar118 = vinsertps_avx(ZEXT416((uint)(pLVar76->vx).field_0.m128[2]),
                                                 ZEXT416((uint)(pLVar76->vy).field_0.m128[2]),0x1c);
                        auVar145 = vinsertps_avx(auVar118,ZEXT416((uint)(pLVar76->vz).field_0.m128
                                                                        [2]),0x28);
                        auVar118 = vdpps_avx(auVar145,local_268,0x7f);
                        auVar196 = vdpps_avx(auVar145,local_278,0x7f);
                        auVar168 = vdpps_avx(auVar145,local_2a8,0x7f);
                        auVar177 = vdpps_avx(auVar145,local_2b8,0x7f);
                        auVar117 = vdpps_avx(auVar145,local_2c8,0x7f);
                        auVar176 = vdpps_avx(auVar145,local_2d8,0x7f);
                        fVar220 = 1.0 - fVar185;
                        auVar94 = vdpps_avx(auVar145,local_288,0x7f);
                        auVar145 = vdpps_avx(auVar145,local_298,0x7f);
                        fVar222 = 1.0 - fVar130;
                        fVar186 = auVar17._4_4_;
                        fVar188 = auVar17._8_4_;
                        fVar190 = auVar17._12_4_;
                        fVar217 = fVar222 * fVar130 * fVar130 * 3.0;
                        auVar239._0_4_ = fVar130 * fVar130 * fVar130;
                        auVar239._4_4_ = fVar186 * fVar186 * fVar186;
                        auVar239._8_4_ = fVar188 * fVar188 * fVar188;
                        auVar239._12_4_ = fVar190 * fVar190 * fVar190;
                        fVar186 = fVar130 * 3.0 * fVar222 * fVar222;
                        fVar188 = fVar222 * fVar222 * fVar222;
                        fVar130 = (fVar220 * auVar118._0_4_ + fVar185 * auVar168._0_4_) * fVar188 +
                                  (fVar220 * auVar196._0_4_ + fVar185 * auVar177._0_4_) * fVar186 +
                                  fVar217 * (fVar220 * auVar94._0_4_ + fVar185 * auVar117._0_4_) +
                                  auVar239._0_4_ *
                                  (auVar176._0_4_ * fVar185 + fVar220 * auVar145._0_4_);
                        if ((fVar103 <= fVar130) &&
                           (fVar185 = *(float *)(ray + k * 4 + 0x80), fVar130 <= fVar185)) {
                          pGVar9 = (context->scene->geometries).items[local_410].ptr;
                          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar77 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar77 = true,
                                  pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1a8 = vshufps_avx(auVar17,auVar17,0x55);
                            auVar287._8_4_ = 0x3f800000;
                            auVar287._0_8_ = &DAT_3f8000003f800000;
                            auVar287._12_4_ = 0x3f800000;
                            auVar118 = vsubps_avx(auVar287,local_1a8);
                            fVar190 = local_1a8._0_4_;
                            fVar220 = local_1a8._4_4_;
                            fVar303 = local_1a8._8_4_;
                            fVar158 = local_1a8._12_4_;
                            fVar304 = auVar118._0_4_;
                            fVar305 = auVar118._4_4_;
                            fVar314 = auVar118._8_4_;
                            fVar291 = auVar118._12_4_;
                            auVar301._0_4_ =
                                 fVar190 * (float)local_3f8._0_4_ + fVar304 * (float)local_3c8._0_4_
                            ;
                            auVar301._4_4_ =
                                 fVar220 * (float)local_3f8._4_4_ + fVar305 * (float)local_3c8._4_4_
                            ;
                            auVar301._8_4_ = fVar303 * fStack_3f0 + fVar314 * fStack_3c0;
                            auVar301._12_4_ = fVar158 * fStack_3ec + fVar291 * fStack_3bc;
                            auVar312._0_4_ = fVar190 * fVar240 + fVar304 * fVar225;
                            auVar312._4_4_ = fVar220 * fVar187 + fVar305 * fVar242;
                            auVar312._8_4_ = fVar303 * fVar218 + fVar314 * fVar191;
                            auVar312._12_4_ = fVar158 * fVar101 + fVar291 * fVar223;
                            auVar321._0_4_ = fVar190 * fVar241 + fVar304 * (float)local_3d8._0_4_;
                            auVar321._4_4_ = fVar220 * fVar189 + fVar305 * (float)local_3d8._4_4_;
                            auVar321._8_4_ = fVar303 * fVar221 + fVar314 * fStack_3d0;
                            auVar321._12_4_ = fVar158 * fVar102 + fVar291 * fStack_3cc;
                            auVar288._0_4_ =
                                 fVar190 * (float)local_408._0_4_ + fVar304 * (float)local_3e8._0_4_
                            ;
                            auVar288._4_4_ =
                                 fVar220 * (float)local_408._4_4_ + fVar305 * (float)local_3e8._4_4_
                            ;
                            auVar288._8_4_ = fVar303 * fStack_400 + fVar314 * fStack_3e0;
                            auVar288._12_4_ = fVar158 * fStack_3fc + fVar291 * fStack_3dc;
                            auVar177 = vsubps_avx(auVar312,auVar301);
                            auVar117 = vsubps_avx(auVar321,auVar312);
                            auVar176 = vsubps_avx(auVar288,auVar321);
                            local_1b8 = vshufps_avx(auVar17,auVar17,0);
                            fVar190 = local_1b8._0_4_;
                            fVar303 = local_1b8._4_4_;
                            fVar158 = local_1b8._8_4_;
                            fVar305 = local_1b8._12_4_;
                            auVar118 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                            fVar220 = auVar118._0_4_;
                            fVar222 = auVar118._4_4_;
                            fVar304 = auVar118._8_4_;
                            fVar314 = auVar118._12_4_;
                            auVar118 = vshufps_avx(auVar239,auVar239,0);
                            auVar196 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
                            auVar168 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                            auVar213._0_4_ =
                                 ((auVar117._0_4_ * fVar220 + auVar176._0_4_ * fVar190) * fVar190 +
                                 (auVar177._0_4_ * fVar220 + auVar117._0_4_ * fVar190) * fVar220) *
                                 3.0;
                            auVar213._4_4_ =
                                 ((auVar117._4_4_ * fVar222 + auVar176._4_4_ * fVar303) * fVar303 +
                                 (auVar177._4_4_ * fVar222 + auVar117._4_4_ * fVar303) * fVar222) *
                                 3.0;
                            auVar213._8_4_ =
                                 ((auVar117._8_4_ * fVar304 + auVar176._8_4_ * fVar158) * fVar158 +
                                 (auVar177._8_4_ * fVar304 + auVar117._8_4_ * fVar158) * fVar304) *
                                 3.0;
                            auVar213._12_4_ =
                                 ((auVar117._12_4_ * fVar314 + auVar176._12_4_ * fVar305) * fVar305
                                 + (auVar177._12_4_ * fVar314 + auVar117._12_4_ * fVar305) * fVar314
                                 ) * 3.0;
                            auVar177 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                            auVar150._0_4_ =
                                 auVar177._0_4_ * (float)local_328._0_4_ +
                                 auVar168._0_4_ * (float)local_338._0_4_ +
                                 auVar118._0_4_ * (float)local_358._0_4_ +
                                 auVar196._0_4_ * (float)local_348._0_4_;
                            auVar150._4_4_ =
                                 auVar177._4_4_ * (float)local_328._4_4_ +
                                 auVar168._4_4_ * (float)local_338._4_4_ +
                                 auVar118._4_4_ * (float)local_358._4_4_ +
                                 auVar196._4_4_ * (float)local_348._4_4_;
                            auVar150._8_4_ =
                                 auVar177._8_4_ * fStack_320 +
                                 auVar168._8_4_ * fStack_330 +
                                 auVar118._8_4_ * fStack_350 + auVar196._8_4_ * fStack_340;
                            auVar150._12_4_ =
                                 auVar177._12_4_ * fStack_31c +
                                 auVar168._12_4_ * fStack_32c +
                                 auVar118._12_4_ * fStack_34c + auVar196._12_4_ * fStack_33c;
                            auVar118 = vshufps_avx(auVar213,auVar213,0xc9);
                            auVar180._0_4_ = auVar150._0_4_ * auVar118._0_4_;
                            auVar180._4_4_ = auVar150._4_4_ * auVar118._4_4_;
                            auVar180._8_4_ = auVar150._8_4_ * auVar118._8_4_;
                            auVar180._12_4_ = auVar150._12_4_ * auVar118._12_4_;
                            auVar118 = vshufps_avx(auVar150,auVar150,0xc9);
                            auVar151._0_4_ = auVar213._0_4_ * auVar118._0_4_;
                            auVar151._4_4_ = auVar213._4_4_ * auVar118._4_4_;
                            auVar151._8_4_ = auVar213._8_4_ * auVar118._8_4_;
                            auVar151._12_4_ = auVar213._12_4_ * auVar118._12_4_;
                            auVar196 = vsubps_avx(auVar151,auVar180);
                            auVar118 = vshufps_avx(auVar196,auVar196,0x55);
                            local_1e8[0] = (RTCHitN)auVar118[0];
                            local_1e8[1] = (RTCHitN)auVar118[1];
                            local_1e8[2] = (RTCHitN)auVar118[2];
                            local_1e8[3] = (RTCHitN)auVar118[3];
                            local_1e8[4] = (RTCHitN)auVar118[4];
                            local_1e8[5] = (RTCHitN)auVar118[5];
                            local_1e8[6] = (RTCHitN)auVar118[6];
                            local_1e8[7] = (RTCHitN)auVar118[7];
                            local_1e8[8] = (RTCHitN)auVar118[8];
                            local_1e8[9] = (RTCHitN)auVar118[9];
                            local_1e8[10] = (RTCHitN)auVar118[10];
                            local_1e8[0xb] = (RTCHitN)auVar118[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar118[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar118[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar118[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar118[0xf];
                            local_1d8 = vshufps_avx(auVar196,auVar196,0xaa);
                            local_1c8 = vshufps_avx(auVar196,auVar196,0);
                            local_198 = local_318._0_8_;
                            uStack_190 = local_318._8_8_;
                            local_188 = local_308._0_8_;
                            uStack_180 = local_308._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar130;
                            local_438 = *local_428;
                            uStack_430 = local_428[1];
                            local_388.valid = (int *)&local_438;
                            local_388.geometryUserPtr = pGVar9->userPtr;
                            local_388.context = context->user;
                            local_388.ray = (RTCRayN *)ray;
                            local_388.hit = local_1e8;
                            local_388.N = 4;
                            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar9->occlusionFilterN)(&local_388);
                            }
                            auVar63._8_8_ = uStack_430;
                            auVar63._0_8_ = local_438;
                            if (auVar63 == (undefined1  [16])0x0) {
                              auVar368 = ZEXT1664(ZEXT816(0));
                              auVar118 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar118 = auVar118 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var14 = context->args->filter;
                              auVar368 = ZEXT1664(ZEXT816(0));
                              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var14)(&local_388);
                                auVar368 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar64._8_8_ = uStack_430;
                              auVar64._0_8_ = local_438;
                              auVar196 = vpcmpeqd_avx(auVar368._0_16_,auVar64);
                              auVar118 = auVar196 ^ _DAT_01febe20;
                              auVar152._8_4_ = 0xff800000;
                              auVar152._0_8_ = 0xff800000ff800000;
                              auVar152._12_4_ = 0xff800000;
                              auVar196 = vblendvps_avx(auVar152,*(undefined1 (*) [16])
                                                                 (local_388.ray + 0x80),auVar196);
                              *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar196;
                            }
                            auVar118 = vpslld_avx(auVar118,0x1f);
                            iVar69 = vmovmskps_avx(auVar118);
                            if (iVar69 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar185;
                            }
                            bVar77 = (char)iVar69 != '\0';
                          }
                          bVar66 = (bool)(bVar66 | bVar77);
                          pLVar76 = local_420;
                        }
                      }
                    }
                    break;
                  }
                  lVar71 = lVar71 + -1;
                } while (lVar71 != 0);
              }
              goto LAB_01030fa8;
            }
          }
          goto LAB_01031353;
        }
      }
LAB_01030fa8:
    } while (bVar54);
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar159),ZEXT416((uint)fVar243),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }